

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O2

LY_ERR yin_parse_content(lysp_yin_ctx *ctx,yin_subelement *subelem_info,size_t subelem_info_size,
                        void *parent,ly_stmt parent_stmt,char **text_content,
                        lysp_ext_instance **exts)

{
  lyxml_ctx **pplVar1;
  byte *pbVar2;
  uint16_t *puVar3;
  lysp_node **pplVar4;
  long *plVar5;
  char cVar6;
  uint uVar7;
  lyd_node *plVar8;
  lysp_node *plVar9;
  char ***values;
  bool bVar10;
  bool bVar11;
  lysp_module *plVar12;
  byte bVar13;
  undefined1 uVar14;
  ushort uVar15;
  LY_ERR LVar16;
  ly_stmt stmt;
  int iVar17;
  int iVar18;
  LY_ERR LVar19;
  long lVar20;
  lys_module *plVar21;
  lysp_restr *plVar22;
  long *plVar23;
  void *pvVar24;
  char **ppcVar25;
  size_t sVar26;
  undefined8 *puVar27;
  lysp_node *plVar28;
  long *plVar29;
  lyxml_ctx *plVar30;
  lys_module *plVar31;
  ushort **ppuVar32;
  int *piVar33;
  ulonglong uVar34;
  undefined1 *puVar35;
  ly_ctx *plVar36;
  yin_subelement *pyVar37;
  char *pcVar38;
  uint64_t parent_stmt_index;
  ushort *puVar39;
  LY_VECODE LVar40;
  ly_ctx *plVar41;
  undefined4 *parent_00;
  long lVar42;
  lysp_deviation *dev;
  long lVar43;
  yin_subelement *pyVar44;
  lysp_ext_instance *plVar45;
  yin_argument arg_type;
  char *pcVar46;
  yang_arg arg_val_type;
  undefined8 uVar47;
  char *pcVar48;
  LY_ERR ret__;
  undefined8 *puVar49;
  byte bVar50;
  ly_stmt lVar51;
  lysp_ext_instance **pplVar52;
  lys_module **pplVar53;
  char *pcVar54;
  char *pcVar55;
  size_t sVar56;
  char *temp_val;
  lys_module *plStack_240;
  lysp_ext_instance **local_238;
  anon_union_8_3_0df1e6ad_for_ly_set_2 aStack_230;
  lys_module *local_220;
  yang_module_stmt gr;
  undefined4 uStack_214;
  lys_module *plStack_210;
  char *local_208;
  undefined8 local_200;
  lys_module *plStack_1f8;
  lysc_module *local_1f0;
  lysc_ident *local_1e8;
  lys_module *plStack_1e0;
  lys_module **local_1d8;
  undefined8 local_1d0;
  lys_module *plStack_1c8;
  ulong local_1c0;
  undefined8 local_1b8;
  lys_module *plStack_1b0;
  ulong local_1a8;
  undefined8 local_1a0;
  lys_module *plStack_198;
  ulong local_190;
  undefined8 local_188;
  lys_module *plStack_180;
  ulong local_178;
  char local_170 [8];
  lys_module *plStack_168;
  undefined2 local_160;
  char local_158 [8];
  lys_module *plStack_150;
  undefined2 local_148;
  undefined4 local_140;
  lys_module *local_138;
  undefined2 local_130;
  undefined1 local_128 [108];
  LYXML_PARSER_STATUS next_status;
  char *ptr;
  lys_module *local_b0;
  lysp_ext_instance **local_a8;
  yin_subelement *local_a0;
  char **local_98;
  lysp_ext_instance **local_90;
  lysp_node *local_88;
  lysp_node *local_80;
  char *local_78;
  char *local_70;
  lysp_module *local_68;
  lysc_module *local_60;
  char *temp_val_3;
  char **local_50;
  lys_module **local_48;
  yin_subelement *local_40;
  long local_38;
  
  plVar30 = ctx->xmlctx;
  local_a0 = subelem_info;
  if (plVar30->status != LYXML_ELEM_CONTENT) {
    __assert_fail("ctx->xmlctx->status == LYXML_ELEM_CONTENT",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yin.c"
                  ,0xd8b,
                  "LY_ERR yin_parse_content(struct lysp_yin_ctx *, struct yin_subelement *, size_t, const void *, enum ly_stmt, const char **, struct lysp_ext_instance **)"
                 );
  }
  pplVar1 = &ctx->xmlctx;
  bVar50 = (byte)subelem_info_size;
  if ((plVar30->field_5).ws_only == '\0') {
    next_status = LYXML_ELEM_CLOSE;
  }
  else {
    local_128._96_8_ = parent;
    LVar16 = lyxml_ctx_peek(plVar30,&next_status);
    if (LVar16 != LY_SUCCESS) {
      return LVar16;
    }
    if (next_status == LYXML_ELEMENT) {
      LVar16 = lyxml_ctx_next(*pplVar1);
      if (LVar16 != LY_SUCCESS) {
        return LVar16;
      }
      bVar13 = 0;
      if ('\0' < (char)bVar50) {
        bVar13 = bVar50;
      }
      local_48 = (lys_module **)(ulong)bVar13;
      local_78 = local_170;
      local_68 = (lysp_module *)local_128;
      local_70 = local_158;
      local_40 = local_a0 + -1;
      local_38 = subelem_info_size + 1;
      local_60 = (lysc_module *)((long)local_48 * 0x18 + 0x18);
      lVar51 = LY_STMT_NONE;
      while (plVar30 = *pplVar1, pplVar53 = local_48, plVar30->status == LYXML_ELEMENT) {
        stmt = yin_match_keyword(ctx,(plVar30->field_5).name,(plVar30->field_6).name_len,
                                 (plVar30->field_3).prefix,(plVar30->field_4).prefix_len,parent_stmt
                                );
        lVar20 = local_38;
        pyVar44 = local_40;
        do {
          pyVar37 = pyVar44;
          lVar20 = lVar20 + -1;
          if (lVar20 == 0) {
            if ((parent_stmt == LY_STMT_DEVIATE) &&
               (((((((stmt == LY_STMT_CONFIG || (stmt == LY_STMT_DEFAULT)) ||
                    (stmt == LY_STMT_EXTENSION_INSTANCE)) ||
                   ((stmt == LY_STMT_MANDATORY || (stmt == LY_STMT_MAX_ELEMENTS)))) ||
                  ((stmt == LY_STMT_MIN_ELEMENTS ||
                   ((stmt == LY_STMT_MUST || (stmt == LY_STMT_TYPE)))))) || (stmt == LY_STMT_UNITS))
                || (stmt == LY_STMT_UNIQUE)))) {
              plVar36 = (ly_ctx *)
                        **(undefined8 **)
                          (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              pcVar46 = lyplg_ext_stmt2str(stmt);
              ly_vlog(plVar36,(char *)0x0,LYVE_SYNTAX_YIN,
                      "Deviate of this type doesn\'t allow \"%s\" as it\'s sub-element.",pcVar46);
              return LY_EVALID;
            }
            plVar36 = (ly_ctx *)
                      **(undefined8 **)
                        (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            uVar7 = *(uint *)&ctx->xmlctx->field_6;
            pcVar46 = (ctx->xmlctx->field_5).name;
            pcVar38 = lyplg_ext_stmt2str(parent_stmt);
            ly_vlog(plVar36,(char *)0x0,LYVE_SYNTAX_YIN,
                    "Unexpected sub-element \"%.*s\" of \"%s\" element.",(ulong)uVar7,pcVar46,
                    pcVar38);
            return LY_EVALID;
          }
          pyVar44 = pyVar37 + 1;
        } while (pyVar37[1].type != stmt);
        if ((parent_stmt == LY_STMT_SUBMODULE) || (parent_stmt == LY_STMT_MODULE)) {
          if ((parent_stmt != LY_STMT_MODULE) && (parent_stmt != LY_STMT_SUBMODULE)) {
            __assert_fail("parent_stmt == LY_STMT_MODULE || parent_stmt == LY_STMT_SUBMODULE",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yin.c"
                          ,0xbe7,
                          "LY_ERR yin_check_relative_order(struct lysp_yin_ctx *, enum ly_stmt, enum ly_stmt, enum ly_stmt)"
                         );
          }
          if (lVar51 != LY_STMT_EXTENSION_INSTANCE) {
            LVar16 = kw2kw_group(ctx,lVar51,&gr);
            if (LVar16 != LY_SUCCESS) {
              return LVar16;
            }
            LVar16 = kw2kw_group(ctx,stmt,(yang_module_stmt *)&temp_val);
            if (LVar16 != LY_SUCCESS) {
              return LVar16;
            }
            if ((yang_module_stmt)temp_val < gr) {
              plVar36 = (ly_ctx *)
                        **(undefined8 **)
                          (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              pcVar38 = lyplg_ext_stmt2str(parent_stmt);
              pcVar48 = lyplg_ext_stmt2str(stmt);
              pcVar46 = lyplg_ext_stmt2str(lVar51);
              pcVar54 = "Invalid order of %s\'s sub-elements \"%s\" can\'t appear after \"%s\".";
              LVar40 = LYVE_SYNTAX_YIN;
              goto LAB_0018081d;
            }
          }
        }
        uVar7 = *(uint *)&pyVar37[1].flags;
        if ((~uVar7 & 0x82) == 0) {
          plVar41 = (ly_ctx *)
                    **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1]
          ;
          plVar36 = (ly_ctx *)lyplg_ext_stmt2str(stmt);
          pcVar46 = lyplg_ext_stmt2str(parent_stmt);
          pcVar38 = "Redefinition of \"%s\" sub-element in \"%s\" element.";
          goto LAB_0018073e;
        }
        if ((uVar7 & 4) != 0) {
          lVar20 = 0;
          while (local_60 != (lysc_module *)(lVar20 + 0x18)) {
            pbVar2 = (byte *)((long)&local_a0->flags + lVar20);
            lVar20 = lVar20 + 0x18;
            if ((*pbVar2 & 0x80) != 0) {
              plVar41 = (ly_ctx *)
                        **(undefined8 **)
                          (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              plVar36 = (ly_ctx *)lyplg_ext_stmt2str(pyVar44->type);
              pcVar46 = lyplg_ext_stmt2str(parent_stmt);
              pcVar38 = 
              "Sub-element \"%s\" of \"%s\" element must be defined as it\'s first sub-element.";
              goto LAB_0018073e;
            }
          }
        }
        if (((uVar7 & 8) != 0) &&
           (plVar8 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1],
           *(byte *)&plVar8[2].schema < 2)) {
          plVar41 = (ly_ctx *)**(undefined8 **)plVar8;
          plVar36 = (ly_ctx *)lyplg_ext_stmt2str(stmt);
          pcVar46 = lyplg_ext_stmt2str(parent_stmt);
          pcVar38 = 
          "Invalid sub-elemnt \"%s\" of \"%s\" element - this sub-element is allowed only in modules with version 1.1 or newer."
          ;
          goto LAB_0018073e;
        }
        pyVar37[1].flags = (ushort)uVar7 | 0x80;
        switch(stmt) {
        case LY_STMT_NOTIFICATION:
          puVar49 = (undefined8 *)pyVar37[1].dest;
          plVar29 = (long *)puVar49[1];
          _gr = (yin_subelement *)0x0;
          plVar28 = (lysp_node *)calloc(1,0x60);
          if (plVar28 == (lysp_node *)0x0) {
            plVar36 = (*pplVar1)->ctx;
            pcVar46 = "yin_parse_notification";
            goto LAB_0017f665;
          }
          lVar20 = *plVar29;
          if (*plVar29 != 0) {
            do {
              lVar43 = lVar20;
              lVar20 = *(long *)(lVar43 + 0x10);
            } while (lVar20 != 0);
            plVar29 = (long *)(lVar43 + 0x10);
          }
          *plVar29 = (long)plVar28;
          plVar28->nodetype = 0x400;
          plVar28->parent = (lysp_node *)*puVar49;
          LVar16 = lyxml_ctx_next(*pplVar1);
          if ((LVar16 == LY_SUCCESS) &&
             (LVar16 = yin_parse_attribute(ctx,YIN_ARG_NAME,&plVar28->name,Y_IDENTIF_ARG,
                                           LY_STMT_NOTIFICATION), LVar16 == LY_SUCCESS)) {
            ppcVar25 = &plVar28[1].name;
            LVar16 = subelems_allocator(ctx,0x10,plVar28,(yin_subelement **)&gr,0x20,ppcVar25,0,0x40
                                        ,ppcVar25,0,0x200,ppcVar25,0,0x400,ppcVar25,0,0x80000,
                                        &plVar28->dsc,2,0x800,&plVar28[1].next,0,0x130000,
                                        &plVar28->iffeatures,0,0x1000,ppcVar25,0,0x2000,ppcVar25,0,
                                        0x4000,ppcVar25,0,"yd_node **, uint32_t *)",plVar28 + 1,8,
                                        0x270000,&plVar28->ref,2,0x2c0000,&plVar28->flags,2,0x2f0000
                                        ,&plVar28[1].nodetype,0,0x8000,ppcVar25,0,0xf0000,0,0);
            pyVar44 = _gr;
            LVar19 = LY_EMEM;
            if (LVar16 == LY_SUCCESS) {
              pplVar52 = &plVar28->exts;
              LVar19 = yin_parse_content(ctx,_gr,0x10,plVar28,LY_STMT_NOTIFICATION,(char **)0x0,
                                         pplVar52);
              sVar56 = 0x10;
              goto LAB_0017dd65;
            }
            goto LAB_00180182;
          }
          break;
        case LY_STMT_INPUT:
        case LY_STMT_OUTPUT:
          puVar49 = (undefined8 *)pyVar37[1].dest;
          _gr = (yin_subelement *)0x0;
          pcVar46 = "output";
          if (stmt == LY_STMT_INPUT) {
            pcVar46 = "input";
          }
          LVar16 = lydict_insert((ly_ctx *)
                                 **(undefined8 **)
                                   (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1],
                                 pcVar46,0,(char **)(puVar49[1] + 0x18));
          if (LVar16 == LY_SUCCESS) {
            *(ushort *)(puVar49[1] + 8) = (ushort)(stmt != LY_STMT_INPUT) * 0x1000 + 0x1000;
            *(undefined8 *)puVar49[1] = *puVar49;
            LVar16 = lyxml_ctx_next(*pplVar1);
            if ((LVar16 == LY_SUCCESS) &&
               (LVar16 = yin_parse_attribute(ctx,YIN_ARG_NONE,(char **)0x0,Y_MAYBE_STR_ARG,stmt),
               LVar16 == LY_SUCCESS)) {
              plVar28 = (lysp_node *)puVar49[1];
              ppcVar25 = &plVar28[1].name;
              LVar16 = subelems_allocator(ctx,0xc,plVar28,(yin_subelement **)&gr,0x20,ppcVar25,8,
                                          0x40,ppcVar25,0,0x200,ppcVar25,0,0x400,ppcVar25,0,0x800,
                                          &plVar28[1].next,0,0x1000,ppcVar25,0,0x2000,ppcVar25,0,
                                          0x4000,ppcVar25,0,"yd_node **, uint32_t *)",plVar28 + 1,8,
                                          0x2f0000,&plVar28[1].nodetype,0,0x8000,ppcVar25,0,0xf0000,
                                          0,0);
              pyVar44 = _gr;
              LVar19 = LY_EMEM;
              if (LVar16 == LY_SUCCESS) {
                LVar19 = yin_parse_content(ctx,_gr,0xc,(void *)puVar49[1],stmt,(char **)0x0,
                                           (lysp_ext_instance **)((long)puVar49[1] + 0x38));
                subelems_deallocator(0xc,pyVar44);
                if (LVar19 == LY_SUCCESS) {
                  LVar16 = yin_unres_exts_add(ctx,*(lysp_ext_instance **)(puVar49[1] + 0x38));
                  if (LVar16 != LY_SUCCESS) break;
                  LVar19 = LY_SUCCESS;
                  if (*(long *)(puVar49[1] + 0x58) != 0) goto LAB_00180182;
                  plVar36 = (ly_ctx *)
                            **(undefined8 **)
                              (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                  pcVar46 = lyplg_ext_stmt2str(stmt);
                  ly_vlog(plVar36,(char *)0x0,LYVE_SYNTAX_YANG,
                          "Missing mandatory keyword \"%s\" as a child of \"%s\".","data-def-stmt",
                          pcVar46);
LAB_0017ed50:
                  LVar19 = LY_EVALID;
                }
              }
              goto LAB_00180182;
            }
          }
          break;
        case LY_STMT_INPUT|LY_STMT_NOTIFICATION:
        case LY_STMT_OUTPUT|LY_STMT_NOTIFICATION:
        case LY_STMT_OUTPUT|LY_STMT_INPUT:
        case LY_STMT_OUTPUT|LY_STMT_INPUT|LY_STMT_NOTIFICATION:
switchD_0017b2d7_caseD_3:
          plVar36 = (*pplVar1)->ctx;
          uVar47 = 0xe90;
LAB_00180c17:
          ly_log(plVar36,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yin.c"
                 ,uVar47);
          return LY_EINT;
        case LY_STMT_ACTION:
switchD_0017b2d7_caseD_8:
          plVar29 = (long *)pyVar37[1].dest;
          plVar23 = (long *)plVar29[1];
          _gr = (yin_subelement *)0x0;
          lVar20 = *plVar29;
          plVar28 = (lysp_node *)calloc(1,0x110);
          if (plVar28 != (lysp_node *)0x0) {
            lVar43 = *plVar23;
            if (*plVar23 != 0) {
              do {
                lVar42 = lVar43;
                lVar43 = *(long *)(lVar42 + 0x10);
              } while (lVar43 != 0);
              plVar23 = (long *)(lVar42 + 0x10);
            }
            *plVar23 = (long)plVar28;
            plVar9 = (lysp_node *)*plVar29;
            plVar28->nodetype = (ushort)(plVar9 != (lysp_node *)0x0) * 0x100 + 0x100;
            plVar28->parent = plVar9;
            LVar16 = lyxml_ctx_next(*pplVar1);
            if (LVar16 == LY_SUCCESS) {
              lVar51 = (uint)(lVar20 == 0) * 8 + LY_STMT_ACTION;
              LVar16 = yin_parse_attribute(ctx,YIN_ARG_NAME,&plVar28->name,Y_IDENTIF_ARG,lVar51);
              if (LVar16 == LY_SUCCESS) {
                local_220 = (lys_module *)&plVar28[1].next;
                LVar16 = subelems_allocator(ctx,9,plVar28,(yin_subelement **)&gr,0x80000,
                                            &plVar28->dsc,2,0x800,&plVar28[1].nodetype,0,0x130000,
                                            &plVar28->iffeatures,0,2,local_220,2,4,
                                            &plVar28[2].iffeatures,2,0x270000,&plVar28->ref,2,
                                            0x2c0000,&plVar28->flags,2,0x2f0000,plVar28 + 1,0,
                                            0xf0000,0,0);
                pyVar44 = _gr;
                LVar19 = LY_EMEM;
                if (LVar16 == LY_SUCCESS) {
                  pplVar52 = &plVar28->exts;
                  LVar19 = yin_parse_content(ctx,_gr,9,plVar28,lVar51,(char **)0x0,pplVar52);
                  subelems_deallocator(9,pyVar44);
                  if (LVar19 == LY_SUCCESS) {
                    if (*(short *)&plVar28[1].name == 0) {
                      *(undefined2 *)&plVar28[1].name = 0x1000;
                      plVar28[1].next = plVar28;
                      LVar16 = lydict_insert((ly_ctx *)
                                             **(undefined8 **)
                                               (ctx->parsed_mods->field_2).dnodes
                                               [ctx->parsed_mods->count - 1],"input",0,
                                             &plVar28[1].ref);
                      if (LVar16 != LY_SUCCESS) break;
                    }
                    if (*(short *)&plVar28[2].exts == 0) {
                      *(undefined2 *)&plVar28[2].exts = 0x2000;
                      plVar28[2].iffeatures = (lysp_qname *)plVar28;
                      LVar16 = lydict_insert((ly_ctx *)
                                             **(undefined8 **)
                                               (ctx->parsed_mods->field_2).dnodes
                                               [ctx->parsed_mods->count - 1],"output",0,
                                             (char **)&plVar28[3].nodetype);
                      if (LVar16 != LY_SUCCESS) break;
                    }
LAB_0017ef44:
                    plVar45 = *pplVar52;
                    goto LAB_0017f41d;
                  }
                }
                goto LAB_00180182;
              }
            }
            break;
          }
          plVar36 = (*pplVar1)->ctx;
          pcVar46 = "yin_parse_action";
LAB_0017f665:
          LVar19 = LY_EMEM;
          ly_log(plVar36,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",pcVar46);
          goto LAB_00180182;
        default:
          lVar51 = stmt;
          if (stmt - LY_STMT_ARG_TEXT < 2) {
            LVar16 = lyxml_ctx_next(*pplVar1);
            if (LVar16 != LY_SUCCESS) {
              return LVar16;
            }
            while ((*pplVar1)->status == LYXML_ATTRIBUTE) {
              LVar16 = lyxml_ctx_next(*pplVar1);
              if (LVar16 != LY_SUCCESS) {
                return LVar16;
              }
              LVar16 = lyxml_ctx_next(*pplVar1);
              if (LVar16 != LY_SUCCESS) {
                return LVar16;
              }
            }
            ppcVar25 = (char **)pyVar37[1].dest;
            pyVar44 = (yin_subelement *)0x0;
            sVar56 = 0;
            pplVar52 = (lysp_ext_instance **)0x0;
            puVar39 = (ushort *)local_128._96_8_;
LAB_00180178:
            LVar16 = yin_parse_content(ctx,pyVar44,sVar56,puVar39,lVar51,ppcVar25,pplVar52);
            break;
          }
          if (stmt == LY_STMT_RPC) goto switchD_0017b2d7_caseD_8;
          if ((stmt == LY_STMT_ANYDATA) || (stmt == LY_STMT_ANYXML)) {
            puVar49 = (undefined8 *)pyVar37[1].dest;
            plVar31 = (lys_module *)calloc(1,0x50);
            if (plVar31 == (lys_module *)0x0) {
              plVar36 = (*pplVar1)->ctx;
              pcVar46 = "yin_parse_any";
              goto LAB_00180c43;
            }
            plVar29 = (long *)puVar49[1];
            lVar20 = *plVar29;
            if (*plVar29 != 0) {
              do {
                lVar43 = lVar20;
                lVar20 = *(long *)(lVar43 + 0x10);
              } while (lVar20 != 0);
              plVar29 = (long *)(lVar43 + 0x10);
            }
            *plVar29 = (long)plVar31;
            *(ushort *)&plVar31->name = (ushort)(stmt == LY_STMT_ANYDATA) << 6 | 0x20;
            plVar31->ctx = (ly_ctx *)*puVar49;
            LVar16 = lyxml_ctx_next(*pplVar1);
            if (LVar16 != LY_SUCCESS) {
              return LVar16;
            }
            LVar16 = yin_parse_attribute(ctx,YIN_ARG_NAME,&plVar31->ns,Y_IDENTIF_ARG,stmt);
            if (LVar16 != LY_SUCCESS) {
              return LVar16;
            }
            _gr = (yin_subelement *)CONCAT44(uStack_214,0x50000);
            plStack_210 = (lys_module *)((long)&plVar31->name + 2);
            local_208 = (char *)CONCAT62(local_208._2_6_,2);
            local_200 = (char *)CONCAT44(local_200._4_4_,0x80000);
            plStack_1f8 = (lys_module *)&plVar31->prefix;
            local_1f0 = (lysc_module *)CONCAT62(local_1f0._2_6_,2);
            local_1e8 = (lysc_ident *)CONCAT44(local_1e8._4_4_,0x130000);
            plStack_1e0 = (lys_module *)&plVar31->org;
            local_1d8 = (lys_module **)((ulong)local_1d8 & 0xffffffffffff0000);
            local_1d0._0_4_ = 0x180000;
            local_1c0 = CONCAT62(local_1c0._2_6_,2);
            local_1b8 = CONCAT44(local_1b8._4_4_,0x1d0000);
            plStack_1b0 = (lys_module *)&plVar31->dsc;
            local_1a8 = local_1a8 & 0xffffffffffff0000;
            local_1a0 = CONCAT44(local_1a0._4_4_,0x270000);
            plStack_198 = (lys_module *)&plVar31->filepath;
            local_190 = CONCAT62(local_190._2_6_,2);
            local_188 = CONCAT44(local_188._4_4_,0x2c0000);
            local_178 = CONCAT62(local_178._2_6_,2);
            local_170[0] = '\0';
            local_170[1] = '\0';
            local_170[2] = '3';
            local_170[3] = '\0';
            plStack_168 = (lys_module *)&plVar31->ref;
            local_160 = 2;
            pcVar46 = local_70;
            pcVar46[0x10] = '\0';
            pcVar46[0x11] = '\0';
            pcVar46[0x12] = '\0';
            pcVar46[0x13] = '\0';
            pcVar46[0x14] = '\0';
            pcVar46[0x15] = '\0';
            pcVar46[0x16] = '\0';
            pcVar46[0x17] = '\0';
            pcVar46[0] = '\0';
            pcVar46[1] = '\0';
            pcVar46[2] = '\0';
            pcVar46[3] = '\0';
            pcVar46[4] = '\0';
            pcVar46[5] = '\0';
            pcVar46[6] = '\0';
            pcVar46[7] = '\0';
            pcVar46[8] = '\0';
            pcVar46[9] = '\0';
            pcVar46[10] = '\0';
            pcVar46[0xb] = '\0';
            pcVar46[0xc] = '\0';
            pcVar46[0xd] = '\0';
            pcVar46[0xe] = '\0';
            pcVar46[0xf] = '\0';
            local_158[0] = '\0';
            local_158[1] = '\0';
            local_158[2] = '\x0f';
            local_158[3] = '\0';
            pplVar52 = (lysp_ext_instance **)&plVar31->contact;
            sVar56 = 9;
            plStack_1c8 = plStack_210;
            plStack_180 = plStack_210;
LAB_0017e4f1:
            LVar19 = yin_parse_content(ctx,(yin_subelement *)&gr,sVar56,plVar31,lVar51,(char **)0x0,
                                       pplVar52);
            if (LVar19 != LY_SUCCESS) goto LAB_00180182;
LAB_0017e508:
            plVar45 = *pplVar52;
LAB_0017f41d:
            LVar16 = yin_unres_exts_add(ctx,plVar45);
            LVar19 = LVar16 + (LVar16 == LY_SUCCESS);
            if (LVar16 == LY_SUCCESS) {
              LVar19 = LY_SUCCESS;
            }
            goto LAB_00180182;
          }
          if (stmt == LY_STMT_AUGMENT) {
            puVar49 = (undefined8 *)pyVar37[1].dest;
            plVar29 = (long *)puVar49[1];
            _gr = (yin_subelement *)0x0;
            plVar28 = (lysp_node *)calloc(1,0x60);
            if (plVar28 != (lysp_node *)0x0) {
              lVar20 = *plVar29;
              if (*plVar29 != 0) {
                do {
                  lVar43 = lVar20;
                  lVar20 = *(long *)(lVar43 + 0x10);
                } while (lVar20 != 0);
                plVar29 = (long *)(lVar43 + 0x10);
              }
              *plVar29 = (long)plVar28;
              plVar28->nodetype = 0x8000;
              plVar28->parent = (lysp_node *)*puVar49;
              LVar16 = lyxml_ctx_next(*pplVar1);
              if (LVar16 == LY_SUCCESS) {
                LVar16 = yin_parse_attribute(ctx,YIN_ARG_TARGET_NODE,&plVar28->name,Y_STR_ARG,
                                             LY_STMT_AUGMENT);
                if (LVar16 == LY_SUCCESS) {
                  if (*plVar28->name == '\0') {
                    ly_log((ly_ctx *)
                           **(undefined8 **)
                             (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1],
                           LY_LLWRN,LY_SUCCESS,"Empty argument of %s statement does not make sense."
                           ,"augment");
                  }
                  plVar9 = plVar28 + 1;
                  local_220 = (lys_module *)&plVar28->ref;
                  LVar16 = subelems_allocator(ctx,0x11,plVar28,(yin_subelement **)&gr,8,
                                              &plVar28[1].next,8,0x20,plVar9,8,0x40,plVar9,0,0x100,
                                              plVar9,0,0x200,plVar9,0,0x400,plVar9,0,0x80000,
                                              &plVar28->dsc,2,0x130000,&plVar28->iffeatures,0,0x1000
                                              ,plVar9,0,0x2000,plVar9,0,0x4000,plVar9,0,1,
                                              &plVar28[1].name,8,0x270000,local_220,2,0x2c0000,
                                              &plVar28->flags,2,0x8000,plVar9,0,0x330000,
                                              &plVar28[1].nodetype,2,0xf0000,0,0);
                  pyVar44 = _gr;
                  LVar19 = LY_EMEM;
                  if (LVar16 == LY_SUCCESS) {
                    pplVar52 = &plVar28->exts;
                    LVar19 = yin_parse_content(ctx,_gr,0x11,plVar28,LY_STMT_AUGMENT,(char **)0x0,
                                               pplVar52);
                    sVar56 = 0x11;
                    goto LAB_0017dd65;
                  }
                  goto LAB_00180182;
                }
              }
              break;
            }
            plVar36 = (*pplVar1)->ctx;
            pcVar46 = "yin_parse_augment";
            goto LAB_0017f665;
          }
          if (stmt == LY_STMT_CASE) {
            puVar49 = (undefined8 *)pyVar37[1].dest;
            _gr = (yin_subelement *)0x0;
            plVar28 = (lysp_node *)calloc(1,0x50);
            if (plVar28 == (lysp_node *)0x0) {
              plVar36 = (*pplVar1)->ctx;
              pcVar46 = "yin_parse_case";
              goto LAB_0017f665;
            }
            plVar29 = (long *)puVar49[1];
            lVar20 = *plVar29;
            if (*plVar29 != 0) {
              do {
                lVar43 = lVar20;
                lVar20 = *(long *)(lVar43 + 0x10);
              } while (lVar20 != 0);
              plVar29 = (long *)(lVar43 + 0x10);
            }
            *plVar29 = (long)plVar28;
            plVar28->nodetype = 0x80;
            plVar28->parent = (lysp_node *)*puVar49;
            LVar16 = lyxml_ctx_next(*pplVar1);
            if ((LVar16 != LY_SUCCESS) ||
               (LVar16 = yin_parse_attribute(ctx,YIN_ARG_NAME,&plVar28->name,Y_IDENTIF_ARG,
                                             LY_STMT_CASE), LVar16 != LY_SUCCESS)) break;
            plVar9 = plVar28 + 1;
            LVar16 = subelems_allocator(ctx,0xe,plVar28,(yin_subelement **)&gr,0x20,plVar9,8,0x40,
                                        plVar9,0,0x200,plVar9,0,0x400,plVar9,0,0x80000,&plVar28->dsc
                                        ,2,0x130000,&plVar28->iffeatures,0,0x1000,plVar9,0,0x2000,
                                        plVar9,0,0x4000,plVar9,0,0x270000,&plVar28->ref,2,0x2c0000,
                                        &plVar28->flags,2,0x8000,plVar9,0,0x330000,
                                        &plVar28[1].nodetype,2,0xf0000,0,0);
            pyVar44 = _gr;
            LVar19 = LY_EMEM;
            if (LVar16 == LY_SUCCESS) {
              pplVar52 = &plVar28->exts;
              LVar19 = yin_parse_content(ctx,_gr,0xe,plVar28,LY_STMT_CASE,(char **)0x0,pplVar52);
              sVar56 = 0xe;
LAB_0017dd65:
              subelems_deallocator(sVar56,pyVar44);
              if (LVar19 == LY_SUCCESS) goto LAB_0017e508;
            }
            goto LAB_00180182;
          }
          if (stmt == LY_STMT_CHOICE) {
            LVar16 = yin_parse_choice(ctx,(tree_node_meta *)pyVar37[1].dest);
            break;
          }
          if (stmt == LY_STMT_CONTAINER) {
            puVar49 = (undefined8 *)pyVar37[1].dest;
            _gr = (yin_subelement *)0x0;
            plVar28 = (lysp_node *)calloc(1,0x80);
            if (plVar28 == (lysp_node *)0x0) {
              plVar36 = (*pplVar1)->ctx;
              pcVar46 = "yin_parse_container";
              goto LAB_0017f665;
            }
            plVar29 = (long *)puVar49[1];
            lVar20 = *plVar29;
            if (*plVar29 != 0) {
              do {
                lVar43 = lVar20;
                lVar20 = *(long *)(lVar43 + 0x10);
              } while (lVar20 != 0);
              plVar29 = (long *)(lVar43 + 0x10);
            }
            *plVar29 = (long)plVar28;
            plVar28->nodetype = 1;
            plVar28->parent = (lysp_node *)*puVar49;
            LVar16 = lyxml_ctx_next(*pplVar1);
            if ((LVar16 == LY_SUCCESS) &&
               (LVar16 = yin_parse_attribute(ctx,YIN_ARG_NAME,&plVar28->name,Y_IDENTIF_ARG,
                                             LY_STMT_CONTAINER), LVar16 == LY_SUCCESS)) {
              ppcVar25 = &plVar28[1].ref;
              local_220 = (lys_module *)&plVar28->iffeatures;
              local_80 = plVar28 + 1;
              local_88 = (lysp_node *)&plVar28[1].exts;
              local_90 = (lysp_ext_instance **)&plVar28[1].next;
              local_98 = &plVar28->ref;
              LVar16 = subelems_allocator(ctx,0x15,plVar28,(yin_subelement **)&gr,8,
                                          &plVar28[1].iffeatures,8,0x20,ppcVar25,8,0x40,ppcVar25,0,
                                          0x200,ppcVar25,0,0x50000,&plVar28->flags,2,0x400,ppcVar25,
                                          0,0x80000,&plVar28->dsc,2,0x800,&plVar28[1].dsc,0,0x130000
                                          ,local_220,0,0x1000,ppcVar25,0,0x2000,ppcVar25,0,0x4000,
                                          ppcVar25,0,"yd_node **, uint32_t *)",local_80,0,1,local_88
                                          ,8,0x250000,local_90,2,0x270000,local_98,2,0x2c0000,
                                          &plVar28->flags,2,0x2f0000,&plVar28[1].name,0,0x8000,
                                          ppcVar25,0,0x330000,&plVar28[1].nodetype,2,0xf0000,0,0);
              pyVar44 = _gr;
              LVar19 = LY_EMEM;
              if (LVar16 == LY_SUCCESS) {
                pplVar52 = &plVar28->exts;
                LVar19 = yin_parse_content(ctx,_gr,0x15,plVar28,LY_STMT_CONTAINER,(char **)0x0,
                                           pplVar52);
                sVar56 = 0x15;
                goto LAB_0017dd65;
              }
              goto LAB_00180182;
            }
            break;
          }
          if (stmt == LY_STMT_GROUPING) {
            puVar49 = (undefined8 *)pyVar37[1].dest;
            plVar29 = (long *)puVar49[1];
            _gr = (yin_subelement *)0x0;
            plVar28 = (lysp_node *)calloc(1,0x68);
            if (plVar28 == (lysp_node *)0x0) {
              plVar36 = (*pplVar1)->ctx;
              pcVar46 = "yin_parse_grouping";
              goto LAB_0017f665;
            }
            lVar20 = *plVar29;
            if (*plVar29 != 0) {
              do {
                lVar43 = lVar20;
                lVar20 = *(long *)(lVar43 + 0x10);
              } while (lVar20 != 0);
              plVar29 = (long *)(lVar43 + 0x10);
            }
            *plVar29 = (long)plVar28;
            plVar28->nodetype = 0x4000;
            plVar28->parent = (lysp_node *)*puVar49;
            LVar16 = lyxml_ctx_next(*pplVar1);
            if ((LVar16 == LY_SUCCESS) &&
               (LVar16 = yin_parse_attribute(ctx,YIN_ARG_NAME,&plVar28->name,Y_IDENTIF_ARG,
                                             LY_STMT_GROUPING), LVar16 == LY_SUCCESS)) {
              pplVar4 = &plVar28[1].next;
              LVar16 = subelems_allocator(ctx,0x10,plVar28,(yin_subelement **)&gr,8,&plVar28[1].name
                                          ,0,0x20,pplVar4,0,0x40,pplVar4,0,0x200,pplVar4,0,0x400,
                                          pplVar4,0,0x80000,&plVar28->dsc,2,0x800,
                                          &plVar28[1].nodetype,0,0x1000,pplVar4,0,0x2000,pplVar4,0,
                                          0x4000,pplVar4,0,1,&plVar28[1].dsc,0,0x270000,
                                          &plVar28->ref,2,0x2c0000,&plVar28->flags,2,0x2f0000,
                                          plVar28 + 1,0,0x8000,pplVar4,0,0xf0000,0,0);
              pyVar44 = _gr;
              LVar19 = LY_EMEM;
              if (LVar16 == LY_SUCCESS) {
                LVar19 = yin_parse_content(ctx,_gr,0x10,plVar28,LY_STMT_GROUPING,(char **)0x0,
                                           &plVar28->exts);
                subelems_deallocator(0x10,pyVar44);
                LVar16 = yin_unres_exts_add(ctx,plVar28->exts);
                if (LVar16 != LY_SUCCESS) break;
                if ((LVar19 == LY_SUCCESS) && (plVar28->parent != (lysp_node *)0x0)) {
                  if (ctx->main_ctx == (lysp_ctx *)0x0) {
                    __assert_fail("ctx->main_ctx",
                                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yin.c"
                                  ,0x9ab,
                                  "LY_ERR yin_parse_grouping(struct lysp_yin_ctx *, struct tree_node_meta *)"
                                 );
                  }
                  LVar16 = ly_set_add(&ctx->main_ctx->grps_nodes,plVar28->parent,'\0',
                                      (uint32_t *)0x0);
                  if (LVar16 != LY_SUCCESS) break;
                }
              }
              goto LAB_00180182;
            }
            break;
          }
          if (stmt == LY_STMT_LEAF) {
            puVar49 = (undefined8 *)pyVar37[1].dest;
            plVar31 = (lys_module *)calloc(1,0xd8);
            if (plVar31 == (lys_module *)0x0) {
              plVar36 = (*pplVar1)->ctx;
              pcVar46 = "yin_parse_leaf";
              goto LAB_00180c43;
            }
            plVar29 = (long *)puVar49[1];
            lVar20 = *plVar29;
            if (*plVar29 != 0) {
              do {
                lVar43 = lVar20;
                lVar20 = *(long *)(lVar43 + 0x10);
              } while (lVar20 != 0);
              plVar29 = (long *)(lVar43 + 0x10);
            }
            *plVar29 = (long)plVar31;
            *(undefined2 *)&plVar31->name = 4;
            plVar31->ctx = (ly_ctx *)*puVar49;
            LVar16 = lyxml_ctx_next(*pplVar1);
            if (LVar16 != LY_SUCCESS) {
              return LVar16;
            }
            LVar16 = yin_parse_attribute(ctx,YIN_ARG_NAME,&plVar31->ns,Y_IDENTIF_ARG,LY_STMT_LEAF);
            if (LVar16 != LY_SUCCESS) {
              return LVar16;
            }
            _gr = (yin_subelement *)CONCAT44(uStack_214,0x50000);
            plStack_210 = (lys_module *)((long)&plVar31->name + 2);
            local_208 = (char *)CONCAT62(local_208._2_6_,2);
            local_200 = (char *)CONCAT44(local_200._4_4_,0x70000);
            plStack_1f8 = (lys_module *)&plVar31[1].dsc;
            local_1f0 = (lysc_module *)CONCAT62(local_1f0._2_6_,2);
            local_1e8 = (lysc_ident *)CONCAT44(local_1e8._4_4_,0x80000);
            plStack_1e0 = (lys_module *)&plVar31->prefix;
            local_1d8 = (lys_module **)CONCAT62(local_1d8._2_6_,2);
            local_1d0._0_4_ = 0x130000;
            plStack_1c8 = (lys_module *)&plVar31->org;
            local_1c0 = local_1c0 & 0xffffffffffff0000;
            local_1b8 = CONCAT44(local_1b8._4_4_,0x180000);
            local_1a8 = CONCAT62(local_1a8._2_6_,2);
            local_1a0 = CONCAT44(local_1a0._4_4_,0x1d0000);
            plStack_198 = (lys_module *)&plVar31->dsc;
            local_190 = local_190 & 0xffffffffffff0000;
            local_188 = CONCAT44(local_188._4_4_,0x270000);
            plStack_180 = (lys_module *)&plVar31->filepath;
            local_178 = CONCAT62(local_178._2_6_,2);
            local_170[0] = '\0';
            local_170[1] = '\0';
            local_170[2] = ',';
            local_170[3] = '\0';
            local_160 = 2;
            local_158[0] = '\0';
            local_158[1] = '\0';
            local_158[2] = '.';
            local_158[3] = '\0';
            plStack_150 = (lys_module *)&plVar31->parsed;
            local_148 = 3;
            local_140 = 0x310000;
            local_138 = (lys_module *)&plVar31[1].contact;
            local_130 = 2;
            local_128._0_4_ = 0x330000;
            local_128._8_8_ = &plVar31->ref;
            local_128._16_2_ = 2;
            local_128._40_8_ = 0;
            local_128._32_8_ = (char **)0x0;
            local_128._24_8_ = 0xf0000;
            pplVar52 = (lysp_ext_instance **)&plVar31->contact;
            sVar56 = 0xc;
            lVar51 = LY_STMT_LEAF;
            plStack_1b0 = plStack_210;
            plStack_168 = plStack_210;
            goto LAB_0017e4f1;
          }
          if (stmt == LY_STMT_LEAF_LIST) {
            puVar49 = (undefined8 *)pyVar37[1].dest;
            plVar31 = (lys_module *)calloc(1,0xd0);
            if (plVar31 == (lys_module *)0x0) {
              plVar36 = (*pplVar1)->ctx;
              pcVar46 = "yin_parse_leaflist";
              goto LAB_00180c43;
            }
            plVar29 = (long *)puVar49[1];
            lVar20 = *plVar29;
            if (*plVar29 != 0) {
              do {
                lVar43 = lVar20;
                lVar20 = *(long *)(lVar43 + 0x10);
              } while (lVar20 != 0);
              plVar29 = (long *)(lVar43 + 0x10);
            }
            *plVar29 = (long)plVar31;
            *(undefined2 *)&plVar31->name = 8;
            plVar31->ctx = (ly_ctx *)*puVar49;
            LVar16 = lyxml_ctx_next(*pplVar1);
            if (LVar16 != LY_SUCCESS) {
              return LVar16;
            }
            LVar16 = yin_parse_attribute(ctx,YIN_ARG_NAME,&plVar31->ns,Y_IDENTIF_ARG,
                                         LY_STMT_LEAF_LIST);
            if (LVar16 != LY_SUCCESS) {
              return LVar16;
            }
            _gr = (yin_subelement *)CONCAT44(uStack_214,0x50000);
            plStack_210 = (lys_module *)((long)&plVar31->name + 2);
            local_208 = (char *)CONCAT62(local_208._2_6_,2);
            local_200 = (char *)CONCAT44(local_200._4_4_,0x70000);
            local_1f0 = (lysc_module *)((ulong)local_1f0 & 0xffffffffffff0000);
            local_1e8 = (lysc_ident *)CONCAT44(local_1e8._4_4_,0x80000);
            plStack_1e0 = (lys_module *)&plVar31->prefix;
            local_1d8 = (lys_module **)CONCAT62(local_1d8._2_6_,2);
            local_1d0._0_4_ = 0x130000;
            plStack_1c8 = (lys_module *)&plVar31->org;
            local_1c0 = local_1c0 & 0xffffffffffff0000;
            local_1b8 = CONCAT44(local_1b8._4_4_,0x190000);
            local_1a8 = CONCAT62(local_1a8._2_6_,2);
            local_1a0 = CONCAT44(local_1a0._4_4_,0x1a0000);
            local_190 = CONCAT62(local_190._2_6_,2);
            local_188 = CONCAT44(local_188._4_4_,0x1d0000);
            plStack_180 = (lys_module *)&plVar31->dsc;
            local_178 = local_178 & 0xffffffffffff0000;
            local_170[0] = '\0';
            local_170[1] = '\0';
            local_170[2] = '\x1f';
            local_170[3] = '\0';
            local_160 = 2;
            local_158[0] = '\0';
            local_158[1] = '\0';
            local_158[2] = '\'';
            local_158[3] = '\0';
            plStack_150 = (lys_module *)&plVar31->filepath;
            local_148 = 2;
            local_140 = 0x2c0000;
            local_130 = 2;
            local_128._0_4_ = 0x2e0000;
            local_128._8_8_ = &plVar31->parsed;
            local_128._16_2_ = 3;
            local_128._24_4_ = 0x310000;
            local_128._32_8_ = &plVar31[1].contact;
            local_128._40_2_ = 2;
            local_128._48_4_ = 0x330000;
            local_128._56_8_ = &plVar31->ref;
            local_128._64_2_ = 2;
            local_128._88_8_ = 0;
            local_128._80_8_ = 0;
            local_128._72_8_ = 0xf0000;
            plStack_1f8 = (lys_module *)&plVar31[1].dsc;
            plStack_1b0 = plVar31;
            plStack_198 = plVar31;
            plStack_168 = plStack_210;
            local_138 = plStack_210;
            LVar16 = yin_parse_content(ctx,(yin_subelement *)&gr,0xe,plVar31,LY_STMT_LEAF_LIST,
                                       (char **)0x0,(lysp_ext_instance **)&plVar31->contact);
            if ((LVar16 == LY_SUCCESS) &&
               (LVar16 = yin_unres_exts_add(ctx,(lysp_ext_instance *)plVar31->contact),
               LVar16 == LY_SUCCESS)) {
              if ((*(uint *)&plVar31[1].ref != 0) && (plVar31[1].dsc != (char *)0x0)) {
                ly_vlog((ly_ctx *)
                        **(undefined8 **)
                          (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1],
                        (char *)0x0,LYVE_SYNTAX_YIN,
                        "Invalid combination of sub-elemnts \"%s\" and \"%s\" in \"%s\" element.",
                        "min-elements","default","leaf-list");
                goto LAB_0017ed50;
              }
              uVar7 = *(uint *)((long)&plVar31[1].ref + 4);
              LVar19 = LY_SUCCESS;
              if (uVar7 < *(uint *)&plVar31[1].ref && uVar7 != 0) {
LAB_0017f904:
                ly_vlog((ly_ctx *)
                        **(undefined8 **)
                          (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1],
                        (char *)0x0,LYVE_SEMANTICS,
                        "Invalid combination of min-elements and max-elements: min value %u is bigger than the max value %u."
                       );
                goto LAB_0017ed50;
              }
              goto LAB_00180182;
            }
            break;
          }
          if (stmt == LY_STMT_LIST) {
            puVar49 = (undefined8 *)pyVar37[1].dest;
            _gr = (yin_subelement *)0x0;
            plVar28 = (lysp_node *)calloc(1,0x90);
            if (plVar28 == (lysp_node *)0x0) {
              plVar36 = (*pplVar1)->ctx;
              pcVar46 = "yin_parse_list";
              goto LAB_0017f665;
            }
            plVar29 = (long *)puVar49[1];
            lVar20 = *plVar29;
            if (*plVar29 != 0) {
              do {
                lVar43 = lVar20;
                lVar20 = *(long *)(lVar43 + 0x10);
              } while (lVar20 != 0);
              plVar29 = (long *)(lVar43 + 0x10);
            }
            *plVar29 = (long)plVar28;
            plVar28->nodetype = 0x10;
            plVar28->parent = (lysp_node *)*puVar49;
            LVar16 = lyxml_ctx_next(*pplVar1);
            if ((LVar16 == LY_SUCCESS) &&
               (LVar16 = yin_parse_attribute(ctx,YIN_ARG_NAME,&plVar28->name,Y_IDENTIF_ARG,
                                             LY_STMT_LIST), LVar16 == LY_SUCCESS)) {
              ppcVar25 = &plVar28[1].ref;
              puVar3 = &plVar28->flags;
              local_220 = (lys_module *)&plVar28->iffeatures;
              local_80 = (lysp_node *)&plVar28[1].next;
              local_88 = plVar28 + 1;
              local_90 = &plVar28[1].exts;
              local_98 = &plVar28->ref;
              local_50 = &plVar28[1].name;
              LVar16 = subelems_allocator(ctx,0x19,plVar28,(yin_subelement **)&gr,8,
                                          &plVar28[1].iffeatures,0,0x20,ppcVar25,0,0x40,ppcVar25,0,
                                          0x200,ppcVar25,0,0x50000,puVar3,2,0x400,ppcVar25,0,0x80000
                                          ,&plVar28->dsc,2,0x800,&plVar28[1].dsc,0,0x130000,
                                          local_220,0,0x160000,local_80,2,0x1000,ppcVar25,0,0x2000,
                                          ppcVar25,0,0x4000,ppcVar25,0,0x190000,plVar28,2,0x1a0000,
                                          plVar28,2,"yd_node **, uint32_t *)",local_88,0,1,local_90,
                                          0,0x1f0000,puVar3,2,0x270000,local_98,2,0x2c0000,puVar3,2,
                                          0x2f0000,local_50,0,0x300000);
              pyVar44 = _gr;
              LVar19 = LY_EMEM;
              if (LVar16 == LY_SUCCESS) {
                LVar19 = yin_parse_content(ctx,_gr,0x19,plVar28,LY_STMT_LIST,(char **)0x0,
                                           &plVar28->exts);
                subelems_deallocator(0x19,pyVar44);
                if (LVar19 == LY_SUCCESS) {
                  LVar16 = yin_unres_exts_add(ctx,plVar28->exts);
                  if (LVar16 != LY_SUCCESS) break;
                  LVar19 = LY_SUCCESS;
                  if ((*(uint *)&plVar28[2].field_0xc != 0) &&
                     (uVar7._0_2_ = plVar28[2].nodetype, uVar7._2_2_ = plVar28[2].flags,
                     *(uint *)&plVar28[2].field_0xc < uVar7)) goto LAB_0017f904;
                }
              }
              goto LAB_00180182;
            }
            break;
          }
          if (stmt == LY_STMT_USES) {
            puVar49 = (undefined8 *)pyVar37[1].dest;
            plVar31 = (lys_module *)calloc(1,0x58);
            if (plVar31 == (lys_module *)0x0) {
              plVar36 = (*pplVar1)->ctx;
              pcVar46 = "yin_parse_uses";
              goto LAB_00180c43;
            }
            plVar29 = (long *)puVar49[1];
            lVar20 = *plVar29;
            if (*plVar29 != 0) {
              do {
                lVar43 = lVar20;
                lVar20 = *(long *)(lVar43 + 0x10);
              } while (lVar20 != 0);
              plVar29 = (long *)(lVar43 + 0x10);
            }
            *plVar29 = (long)plVar31;
            *(undefined2 *)&plVar31->name = 0x800;
            plVar31->ctx = (ly_ctx *)*puVar49;
            LVar16 = lyxml_ctx_next(*pplVar1);
            if (LVar16 != LY_SUCCESS) {
              return LVar16;
            }
            LVar16 = yin_parse_attribute(ctx,YIN_ARG_NAME,&plVar31->ns,Y_PREF_IDENTIF_ARG,
                                         LY_STMT_USES);
            if (LVar16 != LY_SUCCESS) {
              return LVar16;
            }
            _gr = (yin_subelement *)CONCAT44(uStack_214,0x80);
            plStack_210 = (lys_module *)&temp_val;
            local_208 = (char *)((ulong)local_208 & 0xffffffffffff0000);
            local_200 = (char *)CONCAT44(local_200._4_4_,0x80000);
            plStack_1f8 = (lys_module *)&plVar31->prefix;
            local_1f0 = (lysc_module *)CONCAT62(local_1f0._2_6_,2);
            local_1e8 = (lysc_ident *)CONCAT44(local_1e8._4_4_,0x130000);
            plStack_1e0 = (lys_module *)&plVar31->org;
            local_1d8 = (lys_module **)((ulong)local_1d8 & 0xffffffffffff0000);
            local_1d0._0_4_ = 0x270000;
            plStack_1c8 = (lys_module *)&plVar31->filepath;
            local_1c0 = CONCAT62(local_1c0._2_6_,2);
            local_1b8 = CONCAT44(local_1b8._4_4_,0x280000);
            plStack_1b0 = (lys_module *)&plVar31->dsc;
            plStack_240 = (lys_module *)&plVar31->ref;
            local_1a8 = local_1a8 & 0xffffffffffff0000;
            local_1a0 = CONCAT44(local_1a0._4_4_,0x2c0000);
            plStack_198 = (lys_module *)((long)&plVar31->name + 2);
            local_190 = CONCAT62(local_190._2_6_,2);
            local_188 = CONCAT44(local_188._4_4_,0x330000);
            plStack_180 = (lys_module *)&plVar31->parsed;
            local_178 = CONCAT62(local_178._2_6_,2);
            pcVar46 = local_78;
            pcVar46[0x10] = '\0';
            pcVar46[0x11] = '\0';
            pcVar46[0x12] = '\0';
            pcVar46[0x13] = '\0';
            pcVar46[0x14] = '\0';
            pcVar46[0x15] = '\0';
            pcVar46[0x16] = '\0';
            pcVar46[0x17] = '\0';
            pcVar46[0] = '\0';
            pcVar46[1] = '\0';
            pcVar46[2] = '\0';
            pcVar46[3] = '\0';
            pcVar46[4] = '\0';
            pcVar46[5] = '\0';
            pcVar46[6] = '\0';
            pcVar46[7] = '\0';
            pcVar46[8] = '\0';
            pcVar46[9] = '\0';
            pcVar46[10] = '\0';
            pcVar46[0xb] = '\0';
            pcVar46[0xc] = '\0';
            pcVar46[0xd] = '\0';
            pcVar46[0xe] = '\0';
            pcVar46[0xf] = '\0';
            local_170[0] = '\0';
            local_170[1] = '\0';
            local_170[2] = '\x0f';
            local_170[3] = '\0';
            ppcVar25 = &plVar31->contact;
            sVar56 = 8;
            lVar51 = LY_STMT_USES;
            temp_val = (char *)plVar31;
LAB_0017f403:
            LVar19 = yin_parse_content(ctx,(yin_subelement *)&gr,sVar56,plVar31,lVar51,(char **)0x0,
                                       (lysp_ext_instance **)ppcVar25);
            if (LVar19 == LY_SUCCESS) {
              plVar45 = (lysp_ext_instance *)*ppcVar25;
              goto LAB_0017f41d;
            }
            goto LAB_00180182;
          }
          if (stmt == LY_STMT_ARGUMENT) {
            puVar49 = (undefined8 *)pyVar37[1].dest;
            _gr = (yin_subelement *)CONCAT44(uStack_214,0x350000);
            plStack_210 = (lys_module *)*puVar49;
            local_208 = (char *)CONCAT62(local_208._2_6_,2);
            local_1f0 = (lysc_module *)0x0;
            plStack_1f8 = (lys_module *)0x0;
            local_200 = (char *)0xf0000;
            LVar16 = lyxml_ctx_next(*pplVar1);
            if ((LVar16 == LY_SUCCESS) &&
               (LVar16 = yin_parse_attribute(ctx,YIN_ARG_NAME,(char **)puVar49[1],Y_IDENTIF_ARG,
                                             LY_STMT_ARGUMENT), LVar16 == LY_SUCCESS)) {
              sVar56 = 2;
              lVar51 = LY_STMT_ARGUMENT;
              puVar39 = (ushort *)local_128._96_8_;
              goto LAB_0018016e;
            }
            break;
          }
          if (stmt != LY_STMT_BASE) {
            if (stmt == LY_STMT_BELONGS_TO) {
              puVar39 = (ushort *)pyVar37[1].dest;
              _gr = (yin_subelement *)CONCAT44(uStack_214,0x240000);
              plStack_210 = (lys_module *)(puVar39 + 0x48);
              local_208 = (char *)CONCAT62(local_208._2_6_,3);
              local_1f0 = (lysc_module *)0x0;
              plStack_1f8 = (lys_module *)0x0;
              local_200 = (char *)0xf0000;
              LVar16 = lyxml_ctx_next(*pplVar1);
              if ((LVar16 != LY_SUCCESS) ||
                 (LVar16 = yin_parse_attribute(ctx,YIN_ARG_MODULE,&temp_val,Y_IDENTIF_ARG,
                                               LY_STMT_BELONGS_TO), LVar16 != LY_SUCCESS)) break;
              puVar49 = *(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              if ((char *)puVar49[1] == temp_val) {
                lydict_remove(ctx->xmlctx->ctx,temp_val);
                sVar56 = 2;
                lVar51 = LY_STMT_BELONGS_TO;
                goto LAB_0018016e;
              }
              ly_vlog((ly_ctx *)*puVar49,(char *)0x0,LYVE_SYNTAX_YIN,
                      "Submodule \"belongs-to\" value \"%s\" does not match its module name \"%s\"."
                     );
LAB_0017ed3c:
              plVar30 = *pplVar1;
LAB_0017ed43:
              plVar36 = plVar30->ctx;
              pcVar46 = temp_val;
LAB_0017ed4b:
              lydict_remove(plVar36,pcVar46);
              goto LAB_0017ed50;
            }
            if (stmt == LY_STMT_BIT) {
              pvVar24 = pyVar37[1].dest;
              lVar20 = *(long *)((long)pvVar24 + 0x28);
              if (lVar20 == 0) {
                plVar29 = (long *)malloc(0x40);
                if (plVar29 != (long *)0x0) {
                  *plVar29 = 1;
                  goto LAB_0017f11b;
                }
              }
              else {
                lVar43 = *(long *)(lVar20 + -8);
                *(long *)(lVar20 + -8) = lVar43 + 1;
                plVar29 = (long *)realloc((void *)(lVar20 + -8),lVar43 * 0x38 + 0x40);
                if (plVar29 != (long *)0x0) {
LAB_0017f11b:
                  *(long **)((long)pvVar24 + 0x28) = plVar29 + 1;
                  lVar20 = *plVar29;
                  plVar29[lVar20 * 7 + -2] = 0;
                  (plVar29 + lVar20 * 7 + -2)[1] = 0;
                  plVar29[lVar20 * 7 + -4] = 0;
                  (plVar29 + lVar20 * 7 + -4)[1] = 0;
                  plVar29[lVar20 * 7 + -6] = 0;
                  (plVar29 + lVar20 * 7 + -6)[1] = 0;
                  plVar29[lVar20 * 7] = 0;
                  *(byte *)((long)pvVar24 + 0x62) = *(byte *)((long)pvVar24 + 0x62) | 2;
                  LVar16 = lyxml_ctx_next(*pplVar1);
                  if (LVar16 != LY_SUCCESS) {
                    return LVar16;
                  }
                  plVar31 = (lys_module *)(plVar29 + lVar20 * 7 + -6);
                  LVar16 = yin_parse_attribute(ctx,YIN_ARG_NAME,(char **)plVar31,Y_IDENTIF_ARG,
                                               LY_STMT_BIT);
                  if (LVar16 != LY_SUCCESS) {
                    return LVar16;
                  }
                  puVar49 = *(undefined8 **)((long)pvVar24 + 0x28);
                  if (puVar49 != (undefined8 *)0x0) {
                    lVar43 = puVar49[-1];
                    while (lVar43 = lVar43 + -1, lVar43 != 0) {
                      pcVar46 = (char *)*puVar49;
                      puVar49 = puVar49 + 7;
                      plVar36 = plVar31->ctx;
                      iVar18 = strcmp(pcVar46,(char *)plVar36);
                      if (iVar18 == 0) {
                        plVar41 = (ly_ctx *)
                                  **(undefined8 **)
                                    (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                        pcVar38 = "Duplicate identifier \"%s\" of %s statement.";
                        pcVar46 = "bit";
                        LVar40 = LYVE_SYNTAX_YANG;
                        goto LAB_0018074c;
                      }
                    }
                  }
                  plVar21 = (lys_module *)(plVar29 + lVar20 * 7);
                  local_1e8 = (lysc_ident *)CONCAT44(local_1e8._4_4_,0x230000);
                  local_1d0._0_4_ = 0x270000;
                  plStack_1c8 = (lys_module *)&plVar21[-1].identities;
                  local_1b8 = CONCAT44(local_1b8._4_4_,0x2c0000);
                  lVar51 = LY_STMT_BIT;
                  plStack_1e0 = plVar31;
                  plStack_1b0 = plVar21;
LAB_0017f28e:
                  plStack_1f8 = (lys_module *)&plVar21[-1].deviated_by;
                  plStack_210 = (lys_module *)&plVar21[-1].compiled;
                  local_190 = 0;
                  plStack_198 = (lys_module *)0x0;
                  local_1a0 = 0xf0000;
                  local_1a8 = CONCAT62(local_1a8._2_6_,2);
                  local_1c0 = CONCAT62(local_1c0._2_6_,2);
                  local_1d8 = (lys_module **)CONCAT62(local_1d8._2_6_,2);
                  local_1f0 = (lysc_module *)((ulong)local_1f0 & 0xffffffffffff0000);
                  local_200 = (char *)CONCAT44(local_200._4_4_,0x130000);
                  local_208 = (char *)CONCAT62(local_208._2_6_,2);
                  _gr = (yin_subelement *)CONCAT44(uStack_214,0x80000);
                  LVar19 = yin_parse_content(ctx,(yin_subelement *)&gr,6,plVar31,lVar51,(char **)0x0
                                             ,(lysp_ext_instance **)&plVar21[-1].implemented);
                  if (LVar19 != LY_SUCCESS) goto LAB_00180182;
                  plVar45 = *(lysp_ext_instance **)&plVar21[-1].implemented;
LAB_0017f2a8:
                  LVar16 = yin_unres_exts_add(ctx,plVar45);
                  break;
                }
                plVar29 = (long *)(*(long *)((long)pvVar24 + 0x28) + -8);
                *plVar29 = *plVar29 + -1;
              }
              plVar36 = (*pplVar1)->ctx;
              pcVar46 = "yin_parse_bit";
LAB_00180c43:
              ly_log(plVar36,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",pcVar46);
              return LY_EMEM;
            }
            if (stmt == LY_STMT_CONFIG) {
              puVar39 = (ushort *)pyVar37[1].dest;
              temp_val = (char *)0x0;
              local_208 = (char *)0x0;
              _gr = (yin_subelement *)0xf0000;
              plStack_210 = (lys_module *)0x0;
              LVar16 = lyxml_ctx_next(*pplVar1);
              if ((LVar16 == LY_SUCCESS) &&
                 (LVar16 = yin_parse_attribute(ctx,YIN_ARG_VALUE,&temp_val,Y_STR_ARG,LY_STMT_CONFIG)
                 , pcVar46 = temp_val, LVar16 == LY_SUCCESS)) {
                iVar18 = strcmp(temp_val,"true");
                if (iVar18 == 0) {
                  uVar15 = 1;
                }
                else {
                  iVar18 = strcmp(pcVar46,"false");
                  if (iVar18 != 0) {
                    plVar36 = (ly_ctx *)
                              **(undefined8 **)
                                (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                    pcVar38 = 
                    "Invalid value \"%s\" of \"%s\" attribute in \"%s\" element. Valid values are \"%s\" and \"%s\"."
                    ;
                    pcVar55 = "false";
                    pcVar54 = "true";
                    pcVar48 = "config";
                    goto LAB_0017d4fa;
                  }
                  uVar15 = 2;
                }
                *puVar39 = *puVar39 | uVar15;
                lydict_remove(ctx->xmlctx->ctx,pcVar46);
                sVar56 = 1;
                lVar51 = LY_STMT_CONFIG;
                goto LAB_0018016e;
              }
            }
            else if (stmt == LY_STMT_CONTACT) {
LAB_0017b4ce:
              plStack_1f8 = (lys_module *)pyVar37[1].dest;
              plStack_210 = (lys_module *)0x0;
              local_208 = (char *)0x0;
              _gr = (yin_subelement *)0xf0000;
              local_200 = (char *)CONCAT44(local_200._4_4_,0x350004);
              local_1f0 = (lysc_module *)CONCAT62(local_1f0._2_6_,7);
              if (((stmt != LY_STMT_CONTACT) && (stmt != LY_STMT_DESCRIPTION)) &&
                 ((stmt != LY_STMT_ORGANIZATION && (stmt != LY_STMT_REFERENCE)))) {
                __assert_fail("parent_stmt == LY_STMT_ORGANIZATION || parent_stmt == LY_STMT_CONTACT || parent_stmt == LY_STMT_DESCRIPTION || parent_stmt == LY_STMT_REFERENCE"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yin.c"
                              ,0x4e8,
                              "LY_ERR yin_parse_meta(struct lysp_yin_ctx *, const void *, enum ly_stmt, const char **, struct lysp_ext_instance **)"
                             );
              }
              LVar16 = lyxml_ctx_next(*pplVar1);
              if ((LVar16 == LY_SUCCESS) &&
                 (LVar16 = yin_parse_attribute(ctx,YIN_ARG_NONE,(char **)0x0,Y_MAYBE_STR_ARG,stmt),
                 LVar16 == LY_SUCCESS)) {
                sVar56 = 2;
                puVar39 = (ushort *)local_128._96_8_;
LAB_0018016e:
                pyVar44 = (yin_subelement *)&gr;
                ppcVar25 = (char **)0x0;
                pplVar52 = exts;
                goto LAB_00180178;
              }
            }
            else {
              if (stmt != LY_STMT_DEFAULT) {
                if (stmt == LY_STMT_DESCRIPTION) goto LAB_0017b4ce;
                if (stmt == LY_STMT_DEVIATE) {
                  plVar29 = (long *)pyVar37[1].dest;
                  LVar16 = lyxml_ctx_next(*pplVar1);
                  if ((LVar16 != LY_SUCCESS) ||
                     (LVar16 = yin_parse_attribute(ctx,YIN_ARG_VALUE,&temp_val_3,Y_STR_ARG,
                                                   LY_STMT_DEVIATE), pcVar46 = temp_val_3,
                     LVar16 != LY_SUCCESS)) break;
                  iVar18 = strcmp(temp_val_3,"not-supported");
                  if (iVar18 == 0) {
                    uVar14 = 1;
LAB_0017f938:
                    bVar10 = false;
LAB_0017fb02:
                    bVar11 = false;
                  }
                  else {
                    iVar17 = strcmp(pcVar46,"add");
                    if (iVar17 == 0) {
                      uVar14 = 2;
                      bVar10 = true;
                      goto LAB_0017fb02;
                    }
                    iVar17 = strcmp(pcVar46,"replace");
                    if (iVar17 != 0) {
                      iVar17 = strcmp(pcVar46,"delete");
                      if (iVar17 == 0) {
                        uVar14 = 3;
                        goto LAB_0017f938;
                      }
                      ly_vlog((ly_ctx *)
                              **(undefined8 **)
                                (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1],
                              (char *)0x0,LYVE_SYNTAX_YIN,
                              "Invalid value \"%s\" of \"%s\" attribute in \"%s\" element. Valid values are \"%s\", \"%s\", \"%s\" and \"%s\"."
                              ,pcVar46,"value","deviate","not-supported","add","replace","delete");
                      plVar36 = ctx->xmlctx->ctx;
                      pcVar46 = temp_val_3;
                      goto LAB_0017ed4b;
                    }
                    uVar14 = 4;
                    bVar11 = true;
                    bVar10 = false;
                  }
                  lydict_remove((*pplVar1)->ctx,pcVar46);
                  if (iVar18 == 0) {
                    puVar35 = (undefined1 *)calloc(1,0x18);
                    if (puVar35 == (undefined1 *)0x0) goto LAB_001802c4;
                    local_208 = (char *)0x0;
                    _gr = (yin_subelement *)0xf0000;
                    plStack_210 = (lys_module *)0x0;
                    pplVar52 = (lysp_ext_instance **)(puVar35 + 0x10);
                    sVar56 = 1;
                  }
                  else if (bVar10) {
                    puVar35 = (undefined1 *)calloc(1,0x48);
                    if (puVar35 == (undefined1 *)0x0) goto LAB_001802c4;
                    temp_val = puVar35 + 0x3c;
                    plStack_240 = (lys_module *)(puVar35 + 0x38);
                    pplVar52 = (lysp_ext_instance **)(puVar35 + 0x10);
                    _gr = (yin_subelement *)CONCAT44(uStack_214,0x50000);
                    local_208 = (char *)CONCAT62(local_208._2_6_,2);
                    local_200 = (char *)CONCAT44(local_200._4_4_,0x70000);
                    plStack_1f8 = (lys_module *)(puVar35 + 0x30);
                    local_1f0 = (lysc_module *)((ulong)local_1f0 & 0xffffffffffff0000);
                    local_1e8 = (lysc_ident *)CONCAT44(local_1e8._4_4_,0x180000);
                    local_1d8 = (lys_module **)CONCAT62(local_1d8._2_6_,2);
                    local_1d0._0_4_ = 0x190000;
                    plStack_1c8 = (lys_module *)&ptr;
                    local_1c0 = CONCAT62(local_1c0._2_6_,2);
                    local_1b8 = CONCAT44(local_1b8._4_4_,0x1a0000);
                    plStack_1b0 = (lys_module *)&temp_val;
                    local_1a8 = CONCAT62(local_1a8._2_6_,2);
                    local_1a0 = CONCAT44(local_1a0._4_4_,0x1d0000);
                    plStack_198 = (lys_module *)(puVar35 + 0x20);
                    local_190 = local_190 & 0xffffffffffff0000;
                    ptr = puVar35 + 0x40;
                    local_188 = CONCAT44(local_188._4_4_,0x300000);
                    plStack_180 = (lys_module *)(puVar35 + 0x28);
                    local_178 = local_178 & 0xffffffffffff0000;
                    local_170[0] = '\0';
                    local_170[1] = '\0';
                    local_170[2] = '1';
                    local_170[3] = '\0';
                    plStack_168 = (lys_module *)(puVar35 + 0x18);
                    local_160 = 2;
                    pcVar46 = local_70;
                    local_b0 = plStack_240;
                    local_a8 = pplVar52;
                    pcVar46[0] = '\0';
                    pcVar46[1] = '\0';
                    pcVar46[2] = '\0';
                    pcVar46[3] = '\0';
                    pcVar46[4] = '\0';
                    pcVar46[5] = '\0';
                    pcVar46[6] = '\0';
                    pcVar46[7] = '\0';
                    pcVar46[8] = '\0';
                    pcVar46[9] = '\0';
                    pcVar46[10] = '\0';
                    pcVar46[0xb] = '\0';
                    pcVar46[0xc] = '\0';
                    pcVar46[0xd] = '\0';
                    pcVar46[0xe] = '\0';
                    pcVar46[0xf] = '\0';
                    pcVar46[0x10] = '\0';
                    pcVar46[0x11] = '\0';
                    pcVar46[0x12] = '\0';
                    pcVar46[0x13] = '\0';
                    pcVar46[0x14] = '\0';
                    pcVar46[0x15] = '\0';
                    pcVar46[0x16] = '\0';
                    pcVar46[0x17] = '\0';
                    local_158[0] = '\0';
                    local_158[1] = '\0';
                    local_158[2] = '\x0f';
                    local_158[3] = '\0';
                    sVar56 = 9;
                    local_238 = pplVar52;
                    plStack_210 = plStack_240;
                    plStack_1e0 = plStack_240;
                  }
                  else if (bVar11) {
                    puVar35 = (undefined1 *)calloc(1,0x50);
                    if (puVar35 == (undefined1 *)0x0) {
LAB_001802c4:
                      plVar36 = (*pplVar1)->ctx;
                      pcVar46 = "yin_parse_deviate";
                      goto LAB_0017f665;
                    }
                    temp_val = puVar35 + 0x44;
                    plStack_240 = (lys_module *)(puVar35 + 0x40);
                    pplVar52 = (lysp_ext_instance **)(puVar35 + 0x10);
                    ptr = puVar35 + 0x48;
                    _gr = (yin_subelement *)CONCAT44(uStack_214,0x50000);
                    local_208 = (char *)CONCAT62(local_208._2_6_,2);
                    local_200 = (char *)CONCAT44(local_200._4_4_,0x70000);
                    plStack_1f8 = (lys_module *)(puVar35 + 0x28);
                    local_1f0 = (lysc_module *)CONCAT62(local_1f0._2_6_,2);
                    local_1e8 = (lysc_ident *)CONCAT44(local_1e8._4_4_,0x180000);
                    local_1d8 = (lys_module **)CONCAT62(local_1d8._2_6_,2);
                    local_1d0._0_4_ = 0x190000;
                    plStack_1c8 = (lys_module *)&ptr;
                    local_1c0 = CONCAT62(local_1c0._2_6_,2);
                    local_1b8 = CONCAT44(local_1b8._4_4_,0x1a0000);
                    plStack_1b0 = (lys_module *)&temp_val;
                    local_1a8 = CONCAT62(local_1a8._2_6_,2);
                    local_1a0 = CONCAT44(local_1a0._4_4_,0x2e0000);
                    plStack_198 = (lys_module *)(puVar35 + 0x18);
                    local_190 = CONCAT62(local_190._2_6_,2);
                    local_188 = CONCAT44(local_188._4_4_,0x310000);
                    plStack_180 = (lys_module *)(puVar35 + 0x20);
                    local_178 = CONCAT62(local_178._2_6_,2);
                    pcVar46 = local_78;
                    local_b0 = plStack_240;
                    local_a8 = pplVar52;
                    pcVar46[0] = '\0';
                    pcVar46[1] = '\0';
                    pcVar46[2] = '\0';
                    pcVar46[3] = '\0';
                    pcVar46[4] = '\0';
                    pcVar46[5] = '\0';
                    pcVar46[6] = '\0';
                    pcVar46[7] = '\0';
                    pcVar46[8] = '\0';
                    pcVar46[9] = '\0';
                    pcVar46[10] = '\0';
                    pcVar46[0xb] = '\0';
                    pcVar46[0xc] = '\0';
                    pcVar46[0xd] = '\0';
                    pcVar46[0xe] = '\0';
                    pcVar46[0xf] = '\0';
                    pcVar46[0x10] = '\0';
                    pcVar46[0x11] = '\0';
                    pcVar46[0x12] = '\0';
                    pcVar46[0x13] = '\0';
                    pcVar46[0x14] = '\0';
                    pcVar46[0x15] = '\0';
                    pcVar46[0x16] = '\0';
                    pcVar46[0x17] = '\0';
                    local_170[0] = '\0';
                    local_170[1] = '\0';
                    local_170[2] = '\x0f';
                    local_170[3] = '\0';
                    sVar56 = 8;
                    local_238 = pplVar52;
                    plStack_210 = plStack_240;
                    plStack_1e0 = plStack_240;
                  }
                  else {
                    puVar35 = (undefined1 *)calloc(1,0x38);
                    if (puVar35 == (undefined1 *)0x0) goto LAB_001802c4;
                    _gr = (yin_subelement *)CONCAT44(uStack_214,0x70000);
                    plStack_210 = (lys_module *)(puVar35 + 0x30);
                    local_208 = (char *)((ulong)local_208 & 0xffffffffffff0000);
                    local_200 = (char *)CONCAT44(local_200._4_4_,0x1d0000);
                    plStack_1f8 = (lys_module *)(puVar35 + 0x20);
                    local_1f0 = (lysc_module *)((ulong)local_1f0 & 0xffffffffffff0000);
                    local_1e8 = (lysc_ident *)CONCAT44(local_1e8._4_4_,0x300000);
                    plStack_1e0 = (lys_module *)(puVar35 + 0x28);
                    local_1d8 = (lys_module **)((ulong)local_1d8 & 0xffffffffffff0000);
                    local_1d0._0_4_ = 0x310000;
                    plStack_1c8 = (lys_module *)(puVar35 + 0x18);
                    local_1c0 = CONCAT62(local_1c0._2_6_,2);
                    local_1a8 = 0;
                    plStack_1b0 = (lys_module *)0x0;
                    local_1b8 = 0xf0000;
                    pplVar52 = (lysp_ext_instance **)(puVar35 + 0x10);
                    sVar56 = 5;
                  }
                  LVar19 = yin_parse_content(ctx,(yin_subelement *)&gr,sVar56,puVar35,
                                             LY_STMT_DEVIATE,(char **)0x0,pplVar52);
                  if ((LVar19 != LY_SUCCESS) ||
                     (LVar19 = yin_unres_exts_add(ctx,*(lysp_ext_instance **)(puVar35 + 0x10)),
                     LVar19 != LY_SUCCESS)) {
                    free(puVar35);
                    goto LAB_00180182;
                  }
                  *puVar35 = uVar14;
                  lVar20 = *plVar29;
                  if (lVar20 == 0) {
                    *plVar29 = (long)puVar35;
                  }
                  else {
                    do {
                      lVar43 = lVar20;
                      lVar20 = *(long *)(lVar43 + 8);
                    } while (lVar20 != 0);
                    *(undefined1 **)(lVar43 + 8) = puVar35;
                  }
LAB_001804af:
                  LVar19 = LY_SUCCESS;
                  goto LAB_00180182;
                }
                if (stmt != LY_STMT_DEVIATION) {
                  if (stmt == LY_STMT_ENUM) {
                    pvVar24 = pyVar37[1].dest;
                    lVar20 = *(long *)((long)pvVar24 + 0x20);
                    if (lVar20 == 0) {
                      plVar21 = (lys_module *)malloc(0x40);
                      if (plVar21 != (lys_module *)0x0) {
                        plVar21->ctx = (ly_ctx *)0x1;
                        goto LAB_0017e1de;
                      }
                    }
                    else {
                      lVar43 = *(long *)(lVar20 + -8);
                      *(long *)(lVar20 + -8) = lVar43 + 1;
                      plVar21 = (lys_module *)realloc((void *)(lVar20 + -8),lVar43 * 0x38 + 0x40);
                      if (plVar21 != (lys_module *)0x0) {
LAB_0017e1de:
                        *(char ***)((long)pvVar24 + 0x20) = &plVar21->name;
                        plVar41 = plVar21->ctx;
                        lVar20 = (long)plVar41 * 0x38;
                        puVar49 = (undefined8 *)((long)plVar21 + lVar20 + -0x10);
                        *puVar49 = 0;
                        puVar49[1] = 0;
                        puVar49 = (undefined8 *)((long)plVar21 + lVar20 + -0x20);
                        *puVar49 = 0;
                        puVar49[1] = 0;
                        puVar49 = (undefined8 *)((long)plVar21 + lVar20 + -0x30);
                        *puVar49 = 0;
                        puVar49[1] = 0;
                        (&plVar21->ctx)[(long)plVar41 * 7] = (ly_ctx *)0x0;
                        *(byte *)((long)pvVar24 + 0x62) = *(byte *)((long)pvVar24 + 0x62) | 4;
                        LVar16 = lyxml_ctx_next(*pplVar1);
                        if (LVar16 != LY_SUCCESS) {
                          return LVar16;
                        }
                        plVar31 = (lys_module *)((long)plVar21 + lVar20 + -0x30);
                        LVar16 = yin_parse_attribute(ctx,YIN_ARG_NAME,(char **)plVar31,Y_STR_ARG,
                                                     LY_STMT_ENUM);
                        if (LVar16 != LY_SUCCESS) {
                          return LVar16;
                        }
                        plVar36 = plVar31->ctx;
                        local_220 = plVar21;
                        sVar26 = strlen((char *)plVar36);
                        LVar16 = lysp_check_enum_name((lysp_ctx *)ctx,(char *)plVar36,sVar26);
                        if (LVar16 != LY_SUCCESS) {
                          return LVar16;
                        }
                        if (*(char *)&(plVar31->ctx->dict).hash_tab == '\0') {
                          ly_log((ly_ctx *)
                                 **(undefined8 **)
                                   (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1],
                                 LY_LLWRN,LY_SUCCESS,
                                 "Empty argument of %s statement does not make sense.","enum");
                        }
                        puVar49 = *(undefined8 **)((long)pvVar24 + 0x20);
                        if (puVar49 != (undefined8 *)0x0) {
                          lVar20 = puVar49[-1];
                          while (lVar20 = lVar20 + -1, lVar20 != 0) {
                            pcVar46 = (char *)*puVar49;
                            puVar49 = puVar49 + 7;
                            plVar36 = plVar31->ctx;
                            iVar18 = strcmp(pcVar46,(char *)plVar36);
                            if (iVar18 == 0) {
                              plVar41 = (ly_ctx *)
                                        **(undefined8 **)
                                          (ctx->parsed_mods->field_2).dnodes
                                          [ctx->parsed_mods->count - 1];
                              pcVar38 = "Duplicate identifier \"%s\" of %s statement.";
                              pcVar46 = "enum";
                              LVar40 = LYVE_SYNTAX_YANG;
                              goto LAB_0018074c;
                            }
                          }
                        }
                        plVar21 = (lys_module *)(&local_220->ctx + (long)plVar41 * 7);
                        local_1e8 = (lysc_ident *)CONCAT44(local_1e8._4_4_,0x270000);
                        local_1d0._0_4_ = 0x2c0000;
                        local_1b8 = CONCAT44(local_1b8._4_4_,0x320000);
                        lVar51 = LY_STMT_ENUM;
                        plStack_1e0 = (lys_module *)&plVar21[-1].identities;
                        plStack_1c8 = plVar21;
                        plStack_1b0 = plVar31;
                        goto LAB_0017f28e;
                      }
                      plVar29 = (long *)(*(long *)((long)pvVar24 + 0x20) + -8);
                      *plVar29 = *plVar29 + -1;
                    }
                    plVar36 = (*pplVar1)->ctx;
                    pcVar46 = "yin_parse_enum";
                    goto LAB_00180c43;
                  }
                  puVar39 = (ushort *)local_128._96_8_;
                  if (stmt == LY_STMT_ERROR_APP_TAG) {
LAB_0017cf1c:
                    arg_type = YIN_ARG_VALUE;
LAB_0017cf21:
                    arg_val_type = Y_STR_ARG;
LAB_0017cf27:
                    LVar16 = yin_parse_simple_elem
                                       (ctx,puVar39,lVar51,pyVar44,arg_type,arg_val_type,exts);
                    break;
                  }
                  if (stmt == LY_STMT_ERROR_MESSAGE) {
                    plStack_1f8 = (lys_module *)pyVar37[1].dest;
                    plStack_210 = (lys_module *)0x0;
                    local_208 = (char *)0x0;
                    _gr = (yin_subelement *)0xf0000;
                    local_200 = (char *)CONCAT44(local_200._4_4_,0x350005);
                    local_1f0 = (lysc_module *)CONCAT62(local_1f0._2_6_,7);
                    LVar16 = lyxml_ctx_next(*pplVar1);
                    if ((LVar16 != LY_SUCCESS) ||
                       (LVar16 = yin_parse_attribute(ctx,YIN_ARG_NONE,(char **)0x0,Y_MAYBE_STR_ARG,
                                                     LY_STMT_ERROR_MESSAGE), LVar16 != LY_SUCCESS))
                    break;
                    sVar56 = 2;
                    lVar51 = LY_STMT_ERROR_MESSAGE;
                    puVar39 = (ushort *)local_128._96_8_;
                    goto LAB_0018016e;
                  }
                  if (stmt == LY_STMT_EXTENSION) {
                    plVar29 = (long *)pyVar37[1].dest;
                    lVar20 = *plVar29;
                    if (lVar20 == 0) {
                      plVar23 = (long *)malloc(0x40);
                      if (plVar23 != (long *)0x0) {
                        *plVar23 = 1;
                        goto LAB_0017eb5a;
                      }
                    }
                    else {
                      lVar43 = *(long *)(lVar20 + -8);
                      *(long *)(lVar20 + -8) = lVar43 + 1;
                      plVar23 = (long *)realloc((void *)(lVar20 + -8),lVar43 * 0x38 + 0x40);
                      if (plVar23 != (long *)0x0) {
LAB_0017eb5a:
                        *plVar29 = (long)(plVar23 + 1);
                        lVar20 = *plVar23;
                        plVar23[lVar20 * 7 + -2] = 0;
                        (plVar23 + lVar20 * 7 + -2)[1] = 0;
                        plVar23[lVar20 * 7 + -4] = 0;
                        (plVar23 + lVar20 * 7 + -4)[1] = 0;
                        plVar23[lVar20 * 7 + -6] = 0;
                        (plVar23 + lVar20 * 7 + -6)[1] = 0;
                        plVar23[lVar20 * 7] = 0;
                        LVar16 = lyxml_ctx_next(*pplVar1);
                        if (LVar16 != LY_SUCCESS) {
                          return LVar16;
                        }
                        plVar31 = (lys_module *)(plVar23 + lVar20 * 7 + -6);
                        LVar16 = yin_parse_attribute(ctx,YIN_ARG_NAME,(char **)plVar31,Y_IDENTIF_ARG
                                                     ,LY_STMT_EXTENSION);
                        if (LVar16 != LY_SUCCESS) {
                          return LVar16;
                        }
                        plStack_1c8 = (lys_module *)(plVar23 + lVar20 * 7 + -1);
                        _gr = (yin_subelement *)CONCAT44(uStack_214,0x10000);
                        plStack_210 = (lys_module *)&temp_val;
                        local_208 = (char *)CONCAT62(local_208._2_6_,2);
                        local_200 = (char *)CONCAT44(local_200._4_4_,0x80000);
                        plStack_1f8 = (lys_module *)(plVar23 + lVar20 * 7 + -4);
                        local_1f0 = (lysc_module *)CONCAT62(local_1f0._2_6_,2);
                        local_1e8 = (lysc_ident *)CONCAT44(local_1e8._4_4_,0x270000);
                        plStack_1e0 = (lys_module *)(plVar23 + lVar20 * 7 + -3);
                        plStack_240 = (lys_module *)(plVar23 + lVar20 * 7 + -5);
                        local_1d8 = (lys_module **)CONCAT62(local_1d8._2_6_,2);
                        local_1d0._0_4_ = 0x2c0000;
                        local_1c0 = CONCAT62(local_1c0._2_6_,2);
                        local_1a8 = 0;
                        plStack_1b0 = (lys_module *)0x0;
                        local_1b8 = 0xf0000;
                        ppcVar25 = (char **)(plVar23 + lVar20 * 7 + -2);
                        sVar56 = 5;
                        lVar51 = LY_STMT_EXTENSION;
                        temp_val = (char *)plStack_1c8;
                        goto LAB_0017f403;
                      }
                      *(long *)(*plVar29 + -8) = *(long *)(*plVar29 + -8) + -1;
                    }
                    plVar36 = (*pplVar1)->ctx;
                    pcVar46 = "yin_parse_extension";
                    goto LAB_00180c43;
                  }
                  if (stmt == LY_STMT_YIN_ELEMENT) {
                    puVar39 = (ushort *)pyVar37[1].dest;
                    temp_val = (char *)0x0;
                    local_208 = (char *)0x0;
                    _gr = (yin_subelement *)0xf0000;
                    plStack_210 = (lys_module *)0x0;
                    LVar16 = lyxml_ctx_next(*pplVar1);
                    if ((LVar16 == LY_SUCCESS) &&
                       (LVar16 = yin_parse_attribute(ctx,YIN_ARG_VALUE,&temp_val,Y_STR_ARG,
                                                     LY_STMT_YIN_ELEMENT), pcVar46 = temp_val,
                       LVar16 == LY_SUCCESS)) {
                      iVar18 = strcmp(temp_val,"true");
                      if (iVar18 == 0) {
                        uVar15 = 0x80;
                      }
                      else {
                        iVar18 = strcmp(pcVar46,"false");
                        if (iVar18 != 0) {
                          plVar36 = (ly_ctx *)
                                    **(undefined8 **)
                                      (ctx->parsed_mods->field_2).dnodes
                                      [ctx->parsed_mods->count - 1];
                          pcVar38 = 
                          "Invalid value \"%s\" of \"%s\" attribute in \"%s\" element. Valid values are \"%s\" and \"%s\"."
                          ;
                          pcVar55 = "false";
                          pcVar54 = "true";
                          pcVar48 = "yin-element";
                          goto LAB_0017d4fa;
                        }
                        uVar15 = 0x100;
                      }
                      *puVar39 = *puVar39 | uVar15;
                      lydict_remove(ctx->xmlctx->ctx,pcVar46);
                      sVar56 = 1;
                      lVar51 = LY_STMT_YIN_ELEMENT;
                      puVar39 = (ushort *)local_128._96_8_;
                      goto LAB_0018016e;
                    }
                    break;
                  }
                  if (stmt == LY_STMT_FEATURE) {
                    plVar29 = (long *)pyVar37[1].dest;
                    lVar20 = *plVar29;
                    if (lVar20 == 0) {
                      plVar23 = (long *)malloc(0x48);
                      if (plVar23 != (long *)0x0) {
                        *plVar23 = 1;
                        goto LAB_0017e3dc;
                      }
                    }
                    else {
                      lVar43 = *(long *)(lVar20 + -8) + 1;
                      *(long *)(lVar20 + -8) = lVar43;
                      plVar23 = (long *)realloc((void *)(lVar20 + -8),lVar43 * 0x40 | 8);
                      if (plVar23 != (long *)0x0) {
LAB_0017e3dc:
                        *plVar29 = (long)(plVar23 + 1);
                        lVar20 = *plVar23;
                        plVar23[lVar20 * 8 + -1] = 0;
                        (plVar23 + lVar20 * 8 + -1)[1] = 0;
                        plVar23[lVar20 * 8 + -3] = 0;
                        (plVar23 + lVar20 * 8 + -3)[1] = 0;
                        plVar23[lVar20 * 8 + -5] = 0;
                        (plVar23 + lVar20 * 8 + -5)[1] = 0;
                        plVar23[lVar20 * 8 + -7] = 0;
                        (plVar23 + lVar20 * 8 + -7)[1] = 0;
                        LVar16 = lyxml_ctx_next(*pplVar1);
                        if (LVar16 != LY_SUCCESS) {
                          return LVar16;
                        }
                        plVar31 = (lys_module *)(plVar23 + lVar20 * 8 + -7);
                        LVar16 = yin_parse_attribute(ctx,YIN_ARG_NAME,(char **)plVar31,Y_IDENTIF_ARG
                                                     ,LY_STMT_FEATURE);
                        if (LVar16 != LY_SUCCESS) {
                          return LVar16;
                        }
                        plStack_1c8 = (lys_module *)(plVar23 + lVar20 * 8);
                        _gr = (yin_subelement *)CONCAT44(uStack_214,0x80000);
                        plStack_210 = (lys_module *)&plStack_1c8[-1].augmented_by;
                        local_208 = (char *)CONCAT62(local_208._2_6_,2);
                        local_200 = (char *)CONCAT44(local_200._4_4_,0x130000);
                        plStack_1f8 = (lys_module *)&plStack_1c8[-1].parsed;
                        local_1f0 = (lysc_module *)((ulong)local_1f0 & 0xffffffffffff0000);
                        local_1e8 = (lysc_ident *)CONCAT44(local_1e8._4_4_,0x270000);
                        plStack_1e0 = (lys_module *)&plStack_1c8[-1].deviated_by;
                        local_1d8 = (lys_module **)CONCAT62(local_1d8._2_6_,2);
                        local_1d0._0_4_ = 0x2c0000;
                        local_1c0 = CONCAT62(local_1c0._2_6_,2);
                        local_1a8 = 0;
                        plStack_1b0 = (lys_module *)0x0;
                        local_1b8 = 0xf0000;
                        pplVar52 = (lysp_ext_instance **)&plStack_1c8[-1].implemented;
                        sVar56 = 5;
                        lVar51 = LY_STMT_FEATURE;
                        goto LAB_0017e4f1;
                      }
                      *(long *)(*plVar29 + -8) = *(long *)(*plVar29 + -8) + -1;
                    }
                    plVar36 = (*pplVar1)->ctx;
                    pcVar46 = "yin_parse_feature";
                    goto LAB_00180c43;
                  }
                  if (stmt == LY_STMT_FRACTION_DIGITS) {
                    ppcVar25 = (char **)pyVar37[1].dest;
                    temp_val = (char *)0x0;
                    LVar16 = lyxml_ctx_next(*pplVar1);
                    if ((LVar16 != LY_SUCCESS) ||
                       (LVar16 = yin_parse_attribute(ctx,YIN_ARG_VALUE,&temp_val,Y_STR_ARG,
                                                     LY_STMT_FRACTION_DIGITS), pcVar46 = temp_val,
                       LVar16 != LY_SUCCESS)) break;
                    cVar6 = *temp_val;
                    if ((cVar6 == '\0') ||
                       ((cVar6 == '0' ||
                        (ppuVar32 = __ctype_b_loc(),
                        (*(byte *)((long)*ppuVar32 + (long)cVar6 * 2 + 1) & 8) == 0)))) {
                      plVar36 = (ly_ctx *)
                                **(undefined8 **)
                                  (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                    }
                    else {
                      piVar33 = __errno_location();
                      *piVar33 = 0;
                      uVar34 = strtoull(pcVar46,&ptr,10);
                      if ((*ptr == '\0') && (uVar34 < 0x13 && *piVar33 != 0x22)) {
                        lydict_remove(ctx->xmlctx->ctx,temp_val);
                        *(char *)(ppcVar25 + 0xc) = (char)uVar34;
                        *(byte *)((long)ppcVar25 + 0x62) = *(byte *)((long)ppcVar25 + 0x62) | 8;
                        local_208 = (char *)0x0;
                        _gr = (yin_subelement *)0xf0000;
                        plStack_210 = (lys_module *)0x0;
                        pplVar52 = (lysp_ext_instance **)(ppcVar25 + 9);
                        sVar56 = 1;
                        lVar51 = LY_STMT_FRACTION_DIGITS;
LAB_0017c9a8:
                        LVar19 = yin_parse_content(ctx,(yin_subelement *)&gr,sVar56,ppcVar25,lVar51,
                                                   (char **)0x0,pplVar52);
                        if (LVar19 != LY_SUCCESS) goto LAB_00180182;
LAB_0017c9be:
                        plVar45 = *pplVar52;
                        goto LAB_0017f2a8;
                      }
                      plVar36 = (ly_ctx *)
                                **(undefined8 **)
                                  (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                      pcVar46 = temp_val;
                    }
                    pcVar38 = "Invalid value \"%s\" of \"%s\" attribute in \"%s\" element.";
                    pcVar48 = "fraction-digits";
LAB_0017ca7f:
                    ly_vlog(plVar36,(char *)0x0,LYVE_SYNTAX_YIN,pcVar38,pcVar46,"value",pcVar48);
LAB_0017d505:
                    plVar30 = ctx->xmlctx;
                    goto LAB_0017ed43;
                  }
                  if (stmt == LY_STMT_IDENTITY) {
                    plVar29 = (long *)pyVar37[1].dest;
                    lVar20 = *plVar29;
                    if (lVar20 == 0) {
                      plVar23 = (long *)malloc(0x40);
                      if (plVar23 != (long *)0x0) {
                        *plVar23 = 1;
                        goto LAB_0017f2d0;
                      }
                    }
                    else {
                      lVar43 = *(long *)(lVar20 + -8);
                      *(long *)(lVar20 + -8) = lVar43 + 1;
                      plVar23 = (long *)realloc((void *)(lVar20 + -8),lVar43 * 0x38 + 0x40);
                      if (plVar23 != (long *)0x0) {
LAB_0017f2d0:
                        *plVar29 = (long)(plVar23 + 1);
                        lVar20 = *plVar23;
                        plVar23[lVar20 * 7 + -2] = 0;
                        (plVar23 + lVar20 * 7 + -2)[1] = 0;
                        plVar23[lVar20 * 7 + -4] = 0;
                        (plVar23 + lVar20 * 7 + -4)[1] = 0;
                        plVar23[lVar20 * 7 + -6] = 0;
                        (plVar23 + lVar20 * 7 + -6)[1] = 0;
                        plVar23[lVar20 * 7] = 0;
                        LVar16 = lyxml_ctx_next(*pplVar1);
                        if (LVar16 != LY_SUCCESS) {
                          return LVar16;
                        }
                        plVar31 = (lys_module *)(plVar23 + lVar20 * 7 + -6);
                        LVar16 = yin_parse_attribute(ctx,YIN_ARG_NAME,(char **)plVar31,Y_IDENTIF_ARG
                                                     ,LY_STMT_IDENTITY);
                        if (LVar16 != LY_SUCCESS) {
                          return LVar16;
                        }
                        plStack_1b0 = (lys_module *)(plVar23 + lVar20 * 7);
                        _gr = (yin_subelement *)CONCAT44(uStack_214,0x20000);
                        plStack_210 = (lys_module *)&plStack_1b0[-1].identities;
                        local_208 = (char *)((ulong)local_208 & 0xffffffffffff0000);
                        local_200 = (char *)CONCAT44(local_200._4_4_,0x80000);
                        plStack_1f8 = (lys_module *)&plStack_1b0[-1].augmented_by;
                        local_1f0 = (lysc_module *)CONCAT62(local_1f0._2_6_,2);
                        local_1e8 = (lysc_ident *)CONCAT44(local_1e8._4_4_,0x130000);
                        plStack_1e0 = (lys_module *)&plStack_1b0[-1].compiled;
                        local_1d8 = (lys_module **)CONCAT62(local_1d8._2_6_,8);
                        local_1d0._0_4_ = 0x270000;
                        plStack_1c8 = (lys_module *)&plStack_1b0[-1].deviated_by;
                        local_1c0 = CONCAT62(local_1c0._2_6_,2);
                        local_1b8 = CONCAT44(local_1b8._4_4_,0x2c0000);
                        local_1a8 = CONCAT62(local_1a8._2_6_,2);
                        local_190 = 0;
                        plStack_198 = (lys_module *)0x0;
                        local_1a0 = 0xf0000;
                        ppcVar25 = (char **)&plStack_1b0[-1].implemented;
                        sVar56 = 6;
                        lVar51 = LY_STMT_IDENTITY;
                        goto LAB_0017f403;
                      }
                      *(long *)(*plVar29 + -8) = *(long *)(*plVar29 + -8) + -1;
                    }
                    plVar36 = (*pplVar1)->ctx;
                    pcVar46 = "yin_parse_identity";
                    goto LAB_00180c43;
                  }
                  if (stmt == LY_STMT_IF_FEATURE) goto LAB_0017d354;
                  if (stmt == LY_STMT_IMPORT) {
                    puVar49 = (undefined8 *)pyVar37[1].dest;
                    plVar29 = (long *)puVar49[1];
                    lVar20 = *plVar29;
                    if (lVar20 == 0) {
                      puVar27 = (undefined8 *)malloc(0x48);
                      if (puVar27 != (undefined8 *)0x0) {
                        *puVar27 = 1;
                        goto LAB_0017ef64;
                      }
                    }
                    else {
                      lVar43 = *(long *)(lVar20 + -8) + 1;
                      *(long *)(lVar20 + -8) = lVar43;
                      puVar27 = (undefined8 *)realloc((void *)(lVar20 + -8),lVar43 * 0x40 | 8);
                      plVar29 = (long *)puVar49[1];
                      if (puVar27 != (undefined8 *)0x0) {
LAB_0017ef64:
                        *plVar29 = (long)(puVar27 + 1);
                        lVar43 = *(long *)puVar49[1];
                        lVar42 = *(long *)(lVar43 + -8) * 0x40;
                        lVar20 = lVar43 + lVar42;
                        plStack_210 = (lys_module *)(lVar20 + -0x28);
                        *(undefined8 *)(lVar20 + -0x10) = 0;
                        *(undefined8 *)(lVar20 + -8) = 0;
                        *(undefined8 *)(lVar20 + -0x20) = 0;
                        *(undefined8 *)(lVar20 + -0x18) = 0;
                        *(undefined8 *)(lVar20 + -0x30) = 0;
                        *(undefined8 *)(lVar20 + -0x28) = 0;
                        *(undefined8 *)(lVar20 + -0x40) = 0;
                        *(undefined8 *)(lVar20 + -0x38) = 0;
                        _gr = (yin_subelement *)CONCAT44(uStack_214,0x80000);
                        local_208 = (char *)CONCAT62(local_208._2_6_,2);
                        local_200 = (char *)CONCAT44(local_200._4_4_,0x240000);
                        plVar31 = (lys_module *)(lVar43 + -0x30 + lVar42);
                        local_1f0 = (lysc_module *)CONCAT62(local_1f0._2_6_,3);
                        local_1e8 = (lysc_ident *)CONCAT44(local_1e8._4_4_,0x270000);
                        plStack_1e0 = (lys_module *)(lVar43 + -0x20 + lVar42);
                        local_1d8 = (lys_module **)CONCAT62(local_1d8._2_6_,2);
                        local_1d0._0_4_ = 0x2b0000;
                        plStack_1c8 = (lys_module *)(lVar43 + -0xe + lVar42);
                        local_1c0 = CONCAT62(local_1c0._2_6_,2);
                        local_1a8 = 0;
                        plStack_1b0 = (lys_module *)0x0;
                        local_1b8 = 0xf0000;
                        plStack_1f8 = plVar31;
                        LVar16 = lyxml_ctx_next(*pplVar1);
                        if (LVar16 == LY_SUCCESS) {
                          LVar16 = yin_parse_attribute(ctx,YIN_ARG_MODULE,
                                                       (char **)(lVar43 + lVar42 + -0x38),
                                                       Y_IDENTIF_ARG,LY_STMT_IMPORT);
                          if (LVar16 == LY_SUCCESS) {
                            pplVar52 = (lysp_ext_instance **)(lVar43 + lVar42 + -0x18);
                            LVar16 = yin_parse_content(ctx,(yin_subelement *)&gr,5,
                                                       (void *)(lVar43 + lVar42 + -0x40),
                                                       LY_STMT_IMPORT,(char **)0x0,pplVar52);
                            if ((LVar16 == LY_SUCCESS) &&
                               (LVar16 = yin_unres_exts_add(ctx,*pplVar52), LVar16 == LY_SUCCESS)) {
                              LVar19 = lysp_check_prefix((lysp_ctx *)ctx,*(lysp_import **)puVar49[1]
                                                         ,(char *)*puVar49,(char **)plVar31);
                              if (LVar19 != LY_SUCCESS) {
                                LVar19 = LY_EVALID;
                              }
                              goto LAB_00180182;
                            }
                          }
                        }
                        break;
                      }
                      *(long *)(*plVar29 + -8) = *(long *)(*plVar29 + -8) + -1;
                    }
                    plVar36 = (*pplVar1)->ctx;
                    pcVar46 = "yin_parse_import";
                    goto LAB_00180c43;
                  }
                  if (stmt == LY_STMT_INCLUDE) {
                    if ((parent_stmt == LY_STMT_SUBMODULE) &&
                       (plVar8 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1],
                       *(char *)&plVar8[2].schema == '\x02')) {
                      ly_log((ly_ctx *)**(undefined8 **)plVar8,LY_LLWRN,LY_SUCCESS,
                             "YANG version 1.1 expects all includes in main module, includes in submodules (%s) are not necessary."
                             ,plVar8[2].parent);
                    }
                    puVar49 = (undefined8 *)pyVar37[1].dest;
                    plVar29 = (long *)puVar49[1];
                    lVar20 = *plVar29;
                    if (lVar20 == 0) {
                      puVar27 = (undefined8 *)malloc(0x40);
                      if (puVar27 != (undefined8 *)0x0) {
                        *puVar27 = 1;
                        goto LAB_0017ede9;
                      }
                    }
                    else {
                      lVar43 = *(long *)(lVar20 + -8);
                      *(long *)(lVar20 + -8) = lVar43 + 1;
                      puVar27 = (undefined8 *)realloc((void *)(lVar20 + -8),lVar43 * 0x38 + 0x40);
                      plVar29 = (long *)puVar49[1];
                      if (puVar27 != (undefined8 *)0x0) {
LAB_0017ede9:
                        *plVar29 = (long)(puVar27 + 1);
                        lVar20 = *(long *)puVar49[1];
                        lVar43 = *(long *)(lVar20 + -8) * 0x38;
                        puVar27 = (undefined8 *)(lVar20 + -0x18 + lVar43);
                        *puVar27 = 0;
                        puVar27[1] = 0;
                        puVar27 = (undefined8 *)(lVar20 + -0x28 + lVar43);
                        *puVar27 = 0;
                        puVar27[1] = 0;
                        puVar27 = (undefined8 *)(lVar20 + -0x38 + lVar43);
                        *puVar27 = 0;
                        puVar27[1] = 0;
                        *(undefined8 *)(lVar20 + -8 + lVar43) = 0;
                        LVar16 = lyxml_ctx_next(*pplVar1);
                        if (LVar16 != LY_SUCCESS) {
                          return LVar16;
                        }
                        lVar42 = lVar43 + lVar20;
                        ppcVar25 = (char **)(lVar42 + -0x30);
                        LVar16 = yin_parse_attribute(ctx,YIN_ARG_MODULE,ppcVar25,Y_IDENTIF_ARG,
                                                     LY_STMT_INCLUDE);
                        if (LVar16 != LY_SUCCESS) {
                          return LVar16;
                        }
                        pcVar46 = *ppcVar25;
                        iVar18 = strcmp((char *)*puVar49,pcVar46);
                        if (iVar18 != 0) {
                          plVar31 = ly_ctx_get_module_latest((*pplVar1)->ctx,pcVar46);
                          if (plVar31 == (lys_module *)0x0) {
                            plStack_210 = (lys_module *)(lVar42 + -0x28);
                            local_208 = (char *)CONCAT62(local_208._2_6_,10);
                            plStack_1f8 = (lys_module *)(lVar42 + -0x20);
                            local_1f0 = (lysc_module *)CONCAT62(local_1f0._2_6_,10);
                            local_1e8 = (lysc_ident *)CONCAT44(local_1e8._4_4_,0x2b0000);
                            plStack_1e0 = (lys_module *)(lVar42 + -0x10);
                            local_1d8 = (lys_module **)CONCAT62(local_1d8._2_6_,2);
                            local_1c0 = 0;
                            plVar29 = (long *)(lVar43 + lVar20 + -0x38);
                            plStack_1c8 = (lys_module *)0x0;
                            local_1d0._0_1_ = '\0';
                            local_1d0._1_1_ = '\0';
                            local_1d0._2_1_ = '\x0f';
                            local_1d0._3_5_ = 0;
                            pplVar52 = (lysp_ext_instance **)(lVar42 + -0x18);
                            sVar56 = 4;
                            lVar51 = LY_STMT_INCLUDE;
LAB_0017ef2d:
                            local_200 = (char *)CONCAT44(local_200._4_4_,0x270000);
                            _gr = (yin_subelement *)CONCAT44(uStack_214,0x80000);
                            LVar19 = yin_parse_content(ctx,(yin_subelement *)&gr,sVar56,plVar29,
                                                       lVar51,(char **)0x0,pplVar52);
                            if (LVar19 != LY_SUCCESS) goto LAB_00180182;
                            goto LAB_0017ef44;
                          }
                          pcVar46 = *ppcVar25;
                        }
                        plVar36 = (ly_ctx *)
                                  **(undefined8 **)
                                    (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                        pcVar54 = "Name collision between %s and %s of name \"%s\".";
                        pcVar38 = "module";
                        pcVar48 = "submodule";
                        LVar40 = LYVE_SEMANTICS;
LAB_0018081d:
                        ly_vlog(plVar36,(char *)0x0,LVar40,pcVar54,pcVar38,pcVar48,pcVar46);
                        return LY_EVALID;
                      }
                      *(long *)(*plVar29 + -8) = *(long *)(*plVar29 + -8) + -1;
                    }
                    plVar36 = (*pplVar1)->ctx;
                    pcVar46 = "yin_parse_include";
                    goto LAB_00180c43;
                  }
                  if (stmt == LY_STMT_KEY) goto LAB_0017cf1c;
                  if (stmt == LY_STMT_LENGTH) {
                    pvVar24 = pyVar37[1].dest;
                    plVar22 = (lysp_restr *)calloc(1,0x40);
                    *(lysp_restr **)((long)pvVar24 + 0x10) = plVar22;
                    if (plVar22 == (lysp_restr *)0x0) {
                      plVar36 = (*pplVar1)->ctx;
                      pcVar46 = "yin_parse_length";
                      goto LAB_00180c43;
                    }
                    LVar16 = yin_parse_restriction(ctx,LY_STMT_LENGTH,plVar22);
                    if (LVar16 != LY_SUCCESS) {
                      return LVar16;
                    }
                    pbVar2 = (byte *)((long)pvVar24 + 0x62);
                    *pbVar2 = *pbVar2 | 0x10;
                    goto LAB_0018018b;
                  }
                  if (stmt == LY_STMT_MANDATORY) {
                    puVar39 = (ushort *)pyVar37[1].dest;
                    temp_val = (char *)0x0;
                    local_208 = (char *)0x0;
                    _gr = (yin_subelement *)0xf0000;
                    plStack_210 = (lys_module *)0x0;
                    LVar16 = lyxml_ctx_next(*pplVar1);
                    if ((LVar16 == LY_SUCCESS) &&
                       (LVar16 = yin_parse_attribute(ctx,YIN_ARG_VALUE,&temp_val,Y_STR_ARG,
                                                     LY_STMT_MANDATORY), pcVar46 = temp_val,
                       LVar16 == LY_SUCCESS)) {
                      iVar18 = strcmp(temp_val,"true");
                      if (iVar18 == 0) {
                        uVar15 = 0x20;
                      }
                      else {
                        iVar18 = strcmp(pcVar46,"false");
                        if (iVar18 != 0) {
                          plVar36 = (ly_ctx *)
                                    **(undefined8 **)
                                      (ctx->parsed_mods->field_2).dnodes
                                      [ctx->parsed_mods->count - 1];
                          pcVar38 = 
                          "Invalid value \"%s\" of \"%s\" attribute in \"%s\" element. Valid values are \"%s\" and \"%s\"."
                          ;
                          pcVar55 = "false";
                          pcVar54 = "true";
                          pcVar48 = "mandatory";
                          goto LAB_0017d4fa;
                        }
                        uVar15 = 0x40;
                      }
                      *puVar39 = *puVar39 | uVar15;
                      lydict_remove(ctx->xmlctx->ctx,pcVar46);
                      sVar56 = 1;
                      lVar51 = LY_STMT_MANDATORY;
                      goto LAB_0018016e;
                    }
                    break;
                  }
                  if ((stmt == LY_STMT_MAX_ELEMENTS) || (stmt == LY_STMT_MIN_ELEMENTS)) {
                    puVar49 = (undefined8 *)pyVar37[1].dest;
                    if ((stmt != LY_STMT_MAX_ELEMENTS) && (stmt != LY_STMT_MIN_ELEMENTS)) {
                      __assert_fail("cur_stmt == LY_STMT_MAX_ELEMENTS || cur_stmt == LY_STMT_MIN_ELEMENTS"
                                    ,
                                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yin.c"
                                    ,0x5bc,
                                    "LY_ERR yin_parse_minmax(struct lysp_yin_ctx *, enum ly_stmt, enum ly_stmt, void *)"
                                   );
                    }
                    if (parent_stmt == LY_STMT_LEAF_LIST) {
                      lVar20 = (ulong)(stmt == LY_STMT_MAX_ELEMENTS) * 4 + 200;
LAB_0017dfe5:
                      parent_00 = (undefined4 *)((long)puVar49 + lVar20);
                      puVar27 = (undefined8 *)((long)puVar49 + 10);
                      pplVar52 = (lysp_ext_instance **)(puVar49 + 7);
                    }
                    else {
                      if (parent_stmt == LY_STMT_LIST) {
                        lVar20 = (ulong)(stmt == LY_STMT_MAX_ELEMENTS) * 4 + 0x88;
                        goto LAB_0017dfe5;
                      }
                      if (parent_stmt == LY_STMT_DEVIATE) {
                        parent_00 = (undefined4 *)*puVar49;
                        puVar27 = (undefined8 *)puVar49[1];
                        pplVar52 = (lysp_ext_instance **)puVar49[2];
                      }
                      else {
                        if (parent_stmt != LY_STMT_REFINE) {
                          __assert_fail("parent_stmt == LY_STMT_LEAF_LIST || parent_stmt == LY_STMT_REFINE || parent_stmt == LY_STMT_LIST || parent_stmt == LY_STMT_DEVIATE"
                                        ,
                                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yin.c"
                                        ,0x5be,
                                        "LY_ERR yin_parse_minmax(struct lysp_yin_ctx *, enum ly_stmt, enum ly_stmt, void *)"
                                       );
                        }
                        parent_00 = (undefined4 *)
                                    ((long)puVar49 +
                                    (ulong)(stmt == LY_STMT_MAX_ELEMENTS) * 4 + 0x38);
                        puVar27 = puVar49 + 9;
                        pplVar52 = (lysp_ext_instance **)(puVar49 + 8);
                      }
                    }
                    if (stmt != LY_STMT_MAX_ELEMENTS) {
                      temp_val = (char *)0x0;
                      local_208 = (char *)0x0;
                      _gr = (yin_subelement *)0xf0000;
                      plStack_210 = (lys_module *)0x0;
                      *(byte *)((long)puVar27 + 1) = *(byte *)((long)puVar27 + 1) | 2;
                      LVar16 = lyxml_ctx_next(*pplVar1);
                      if (LVar16 != LY_SUCCESS) {
                        return LVar16;
                      }
                      LVar16 = yin_parse_attribute(ctx,YIN_ARG_VALUE,&temp_val,Y_STR_ARG,
                                                   LY_STMT_MIN_ELEMENTS);
                      pcVar46 = temp_val;
                      if (LVar16 != LY_SUCCESS) {
                        return LVar16;
                      }
                      if (temp_val == (char *)0x0) {
LAB_001808b8:
                        plVar36 = (ly_ctx *)
                                  **(undefined8 **)
                                    (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                        pcVar46 = "Invalid value \"%s\" of \"%s\" attribute in \"%s\" element.";
LAB_00180a63:
                        ly_vlog(plVar36,(char *)0x0,LYVE_SYNTAX_YIN,pcVar46,temp_val,"value",
                                "min-elements");
                        lydict_remove(ctx->xmlctx->ctx,temp_val);
                        return LY_EVALID;
                      }
                      if (*temp_val == '0') {
                        if (temp_val[1] != '\0') goto LAB_001808b8;
                      }
                      else if (*temp_val == '\0') goto LAB_001808b8;
                      piVar33 = __errno_location();
                      *piVar33 = 0;
                      uVar34 = strtoull(pcVar46,&ptr,10);
                      if (*ptr != '\0') {
                        plVar36 = (ly_ctx *)
                                  **(undefined8 **)
                                    (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                        pcVar46 = "Invalid value \"%s\" of \"%s\" attribute in \"%s\" element.";
                        goto LAB_00180a63;
                      }
                      if ((*piVar33 == 0x22) || (uVar34 >> 0x20 != 0)) {
                        plVar36 = (ly_ctx *)
                                  **(undefined8 **)
                                    (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                        pcVar46 = 
                        "Value \"%s\" of \"%s\" attribute in \"%s\" element is out of bounds.";
                        goto LAB_00180a63;
                      }
                      *parent_00 = (int)uVar34;
                      lydict_remove(ctx->xmlctx->ctx,temp_val);
                      LVar16 = yin_parse_content(ctx,(yin_subelement *)&gr,1,parent_00,
                                                 LY_STMT_MIN_ELEMENTS,(char **)0x0,pplVar52);
                      goto LAB_0017e190;
                    }
                    temp_val = (char *)0x0;
                    local_208 = (char *)0x0;
                    _gr = (yin_subelement *)0xf0000;
                    plStack_210 = (lys_module *)0x0;
                    *(byte *)((long)puVar27 + 1) = *(byte *)((long)puVar27 + 1) | 4;
                    LVar19 = lyxml_ctx_next(*pplVar1);
                    if ((LVar19 == LY_SUCCESS) &&
                       (LVar19 = yin_parse_attribute(ctx,YIN_ARG_VALUE,&temp_val,Y_STR_ARG,
                                                     LY_STMT_MAX_ELEMENTS), pcVar46 = temp_val,
                       LVar19 == LY_SUCCESS)) {
                      if (((temp_val == (char *)0x0) ||
                          ((cVar6 = *temp_val, cVar6 == '\0' || (cVar6 == '0')))) ||
                         ((cVar6 != 'u' &&
                          (ppuVar32 = __ctype_b_loc(),
                          (*(byte *)((long)*ppuVar32 + (long)cVar6 * 2 + 1) & 8) == 0)))) {
                        plVar36 = (ly_ctx *)
                                  **(undefined8 **)
                                    (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                        pcVar38 = "Invalid value \"%s\" of \"%s\" attribute in \"%s\" element.";
                      }
                      else {
                        iVar18 = strcmp(pcVar46,"unbounded");
                        if (iVar18 == 0) {
LAB_001804be:
                          LVar19 = yin_parse_content(ctx,(yin_subelement *)&gr,1,parent_00,
                                                     LY_STMT_MAX_ELEMENTS,(char **)0x0,pplVar52);
                          goto LAB_0017e051;
                        }
                        piVar33 = __errno_location();
                        *piVar33 = 0;
                        uVar34 = strtoull(pcVar46,&ptr,10);
                        pcVar46 = temp_val;
                        if (*ptr == '\0') {
                          if (uVar34 >> 0x20 == 0 && *piVar33 != 0x22) {
                            *parent_00 = (int)uVar34;
                            goto LAB_001804be;
                          }
                          plVar36 = (ly_ctx *)
                                    **(undefined8 **)
                                      (ctx->parsed_mods->field_2).dnodes
                                      [ctx->parsed_mods->count - 1];
                          pcVar38 = 
                          "Value \"%s\" of \"%s\" attribute in \"%s\" element is out of bounds.";
                        }
                        else {
                          plVar36 = (ly_ctx *)
                                    **(undefined8 **)
                                      (ctx->parsed_mods->field_2).dnodes
                                      [ctx->parsed_mods->count - 1];
                          pcVar38 = "Invalid value \"%s\" of \"%s\" attribute in \"%s\" element.";
                        }
                      }
                      pcVar48 = "max-elements";
                      goto LAB_0017f6e3;
                    }
                  }
                  else {
                    if (stmt == LY_STMT_MODIFIER) {
                      ppcVar25 = (char **)pyVar37[1].dest;
                      local_208 = (char *)0x0;
                      _gr = (yin_subelement *)0xf0000;
                      plStack_210 = (lys_module *)0x0;
                      if (**ppcVar25 != '\x06') {
                        __assert_fail("**pat == 0x06",
                                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yin.c"
                                      ,0x3c1,
                                      "LY_ERR yin_parse_modifier(struct lysp_yin_ctx *, const void *, const char **, struct lysp_ext_instance **)"
                                     );
                      }
                      LVar16 = lyxml_ctx_next(*pplVar1);
                      if ((LVar16 == LY_SUCCESS) &&
                         (LVar16 = yin_parse_attribute(ctx,YIN_ARG_VALUE,&temp_val,Y_STR_ARG,
                                                       LY_STMT_MODIFIER), pcVar46 = temp_val,
                         LVar16 == LY_SUCCESS)) {
                        iVar18 = strcmp(temp_val,"invert-match");
                        if (iVar18 != 0) {
                          plVar36 = (ly_ctx *)
                                    **(undefined8 **)
                                      (ctx->parsed_mods->field_2).dnodes
                                      [ctx->parsed_mods->count - 1];
                          pcVar38 = 
                          "Invalid value \"%s\" of \"%s\" attribute in \"%s\" element. Only valid value is \"%s\"."
                          ;
                          pcVar48 = "modifier";
                          goto LAB_0017ca7f;
                        }
                        lydict_remove((*pplVar1)->ctx,pcVar46);
                        pcVar46 = *ppcVar25;
                        sVar26 = strlen(pcVar46);
                        pcVar38 = (char *)malloc(sVar26 + 1);
                        if (pcVar38 == (char *)0x0) {
                          plVar36 = (*pplVar1)->ctx;
                          pcVar46 = "yin_parse_modifier";
                          goto LAB_0017f665;
                        }
                        strcpy(pcVar38,pcVar46);
                        lydict_remove((*pplVar1)->ctx,pcVar46);
                        *pcVar38 = '\x15';
                        LVar16 = lydict_insert_zc((*pplVar1)->ctx,pcVar38,ppcVar25);
                        if (LVar16 == LY_SUCCESS) {
                          sVar56 = 1;
                          lVar51 = LY_STMT_MODIFIER;
                          puVar39 = (ushort *)local_128._96_8_;
                          goto LAB_0018016e;
                        }
                      }
                      break;
                    }
                    if (stmt == LY_STMT_MUST) {
                      plVar29 = (long *)pyVar37[1].dest;
                      lVar20 = *plVar29;
                      if (lVar20 == 0) {
                        plVar23 = (long *)malloc(0x48);
                        if (plVar23 != (long *)0x0) {
                          *plVar23 = 1;
                          goto LAB_0017ed97;
                        }
                      }
                      else {
                        lVar43 = *(long *)(lVar20 + -8) + 1;
                        *(long *)(lVar20 + -8) = lVar43;
                        plVar23 = (long *)realloc((void *)(lVar20 + -8),lVar43 * 0x40 | 8);
                        if (plVar23 != (long *)0x0) {
LAB_0017ed97:
                          *plVar29 = (long)(plVar23 + 1);
                          plVar23 = plVar23 + *plVar23 * 8;
                          plVar23[-1] = 0;
                          *plVar23 = 0;
                          plVar23[-3] = 0;
                          plVar23[-2] = 0;
                          plVar23[-5] = 0;
                          plVar23[-4] = 0;
                          (((lysp_restr *)(plVar23 + -7))->arg).str = (char *)0x0;
                          plVar23[-6] = 0;
                          LVar16 = yin_parse_restriction
                                             (ctx,LY_STMT_MUST,(lysp_restr *)(plVar23 + -7));
                          break;
                        }
                        *(long *)(*plVar29 + -8) = *(long *)(*plVar29 + -8) + -1;
                      }
                      plVar36 = (*pplVar1)->ctx;
                      pcVar46 = "yin_parse_must";
                      goto LAB_00180c43;
                    }
                    if (stmt == LY_STMT_NAMESPACE) {
                      lVar51 = LY_STMT_NAMESPACE;
                      arg_type = YIN_ARG_URI;
                      goto LAB_0017cf21;
                    }
                    if (stmt == LY_STMT_ORDERED_BY) {
                      puVar39 = (ushort *)pyVar37[1].dest;
                      local_208 = (char *)0x0;
                      _gr = (yin_subelement *)0xf0000;
                      plStack_210 = (lys_module *)0x0;
                      LVar16 = lyxml_ctx_next(*pplVar1);
                      if ((LVar16 == LY_SUCCESS) &&
                         (LVar16 = yin_parse_attribute(ctx,YIN_ARG_VALUE,&temp_val,Y_STR_ARG,
                                                       LY_STMT_ORDERED_BY), pcVar46 = temp_val,
                         LVar16 == LY_SUCCESS)) {
                        iVar18 = strcmp(temp_val,"system");
                        if (iVar18 == 0) {
                          uVar15 = 0x80;
                        }
                        else {
                          iVar18 = strcmp(pcVar46,"user");
                          if (iVar18 != 0) {
                            plVar36 = (ly_ctx *)
                                      **(undefined8 **)
                                        (ctx->parsed_mods->field_2).dnodes
                                        [ctx->parsed_mods->count - 1];
                            pcVar38 = 
                            "Invalid value \"%s\" of \"%s\" attribute in \"%s\" element. Valid values are \"%s\" and \"%s\"."
                            ;
                            pcVar55 = "user";
                            pcVar54 = "system";
                            pcVar48 = "ordered-by";
                            goto LAB_0017d4fa;
                          }
                          uVar15 = 0x40;
                        }
                        *puVar39 = *puVar39 | uVar15;
                        lydict_remove(ctx->xmlctx->ctx,pcVar46);
                        sVar56 = 1;
                        lVar51 = LY_STMT_ORDERED_BY;
                        puVar39 = (ushort *)local_128._96_8_;
                        goto LAB_0018016e;
                      }
                      break;
                    }
                    if (stmt == LY_STMT_ORGANIZATION) goto LAB_0017b4ce;
                    if (stmt == LY_STMT_PATH) {
                      pvVar24 = pyVar37[1].dest;
                      LVar16 = yin_parse_simple_element
                                         (ctx,pvVar24,LY_STMT_PATH,(char **)&gr,YIN_ARG_VALUE,
                                          Y_STR_ARG,(lysp_ext_instance **)((long)pvVar24 + 0x48));
                      if (LVar16 != LY_SUCCESS) break;
                      LVar19 = ly_path_parse((*pplVar1)->ctx,(lysc_node *)0x0,(char *)_gr,0,'\x01',2
                                             ,0x10,0x400,(lyxp_expr **)((long)pvVar24 + 0x30));
                      lydict_remove((*pplVar1)->ctx,(char *)_gr);
                      if (LVar19 != LY_SUCCESS) goto LAB_00180182;
                      *(byte *)((long)pvVar24 + 0x62) = *(byte *)((long)pvVar24 + 0x62) | 0x20;
                      goto LAB_001804af;
                    }
                    if (stmt == LY_STMT_PATTERN) {
                      pvVar24 = pyVar37[1].dest;
                      temp_val = (char *)0x0;
                      lVar20 = *(long *)((long)pvVar24 + 0x18);
                      if (lVar20 == 0) {
                        plVar29 = (long *)malloc(0x48);
                        if (plVar29 != (long *)0x0) {
                          *plVar29 = 1;
                          goto LAB_0017e772;
                        }
                      }
                      else {
                        lVar43 = *(long *)(lVar20 + -8) + 1;
                        *(long *)(lVar20 + -8) = lVar43;
                        plVar29 = (long *)realloc((void *)(lVar20 + -8),lVar43 * 0x40 | 8);
                        if (plVar29 != (long *)0x0) {
LAB_0017e772:
                          *(long **)((long)pvVar24 + 0x18) = plVar29 + 1;
                          lVar20 = *plVar29;
                          plVar29[lVar20 * 8 + -1] = 0;
                          (plVar29 + lVar20 * 8 + -1)[1] = 0;
                          plVar29[lVar20 * 8 + -3] = 0;
                          (plVar29 + lVar20 * 8 + -3)[1] = 0;
                          plVar29[lVar20 * 8 + -5] = 0;
                          (plVar29 + lVar20 * 8 + -5)[1] = 0;
                          plVar29[lVar20 * 8 + -7] = 0;
                          (plVar29 + lVar20 * 8 + -7)[1] = 0;
                          LVar16 = lyxml_ctx_next(*pplVar1);
                          if ((LVar16 == LY_SUCCESS) &&
                             (LVar16 = yin_parse_attribute(ctx,YIN_ARG_VALUE,&temp_val,Y_STR_ARG,
                                                           LY_STMT_PATTERN), pcVar46 = temp_val,
                             LVar16 == LY_SUCCESS)) {
                            sVar26 = strlen(temp_val);
                            pcVar38 = (char *)malloc(sVar26 + 2);
                            if (pcVar38 == (char *)0x0) goto LAB_0017e94b;
                            local_220 = (lys_module *)(plVar29 + lVar20 * 8 + -7);
                            memmove(pcVar38 + 1,pcVar46,sVar26);
                            lydict_remove((*pplVar1)->ctx,pcVar46);
                            *pcVar38 = '\x06';
                            pcVar38[sVar26 + 1] = '\0';
                            LVar16 = lydict_insert_zc((*pplVar1)->ctx,pcVar38,(char **)local_220);
                            if (LVar16 == LY_SUCCESS) {
                              pplVar52 = (lysp_ext_instance **)(plVar29 + lVar20 * 8);
                              pplVar52[-6] = (lysp_ext_instance *)
                                             (ctx->parsed_mods->field_2).dnodes
                                             [ctx->parsed_mods->count - 1];
                              *(byte *)((long)pvVar24 + 0x62) =
                                   *(byte *)((long)pvVar24 + 0x62) | 0x40;
                              _gr = (yin_subelement *)CONCAT44(uStack_214,0x80000);
                              plStack_210 = (lys_module *)(pplVar52 + -2);
                              local_208 = (char *)CONCAT62(local_208._2_6_,2);
                              local_200 = (char *)CONCAT44(local_200._4_4_,0xc0000);
                              plStack_1f8 = (lys_module *)(pplVar52 + -3);
                              local_1f0 = (lysc_module *)CONCAT62(local_1f0._2_6_,2);
                              local_1e8 = (lysc_ident *)CONCAT44(local_1e8._4_4_,0xd0000);
                              plStack_1e0 = (lys_module *)(pplVar52 + -4);
                              local_1d8 = (lys_module **)CONCAT62(local_1d8._2_6_,2);
                              local_1d0._0_4_ = 0x1b0000;
                              plStack_1c8 = local_220;
                              local_1c0 = CONCAT62(local_1c0._2_6_,2);
                              local_1b8 = CONCAT44(local_1b8._4_4_,0x270000);
                              plStack_1b0 = (lys_module *)(pplVar52 + -1);
                              local_1a8 = CONCAT62(local_1a8._2_6_,2);
                              local_190 = 0;
                              plStack_198 = (lys_module *)0x0;
                              local_1a0 = 0xf0000;
                              sVar56 = 6;
                              plVar31 = local_220;
                              lVar51 = LY_STMT_PATTERN;
                              goto LAB_0017e4f1;
                            }
                          }
                          break;
                        }
                        plVar29 = (long *)(*(long *)((long)pvVar24 + 0x18) + -8);
                        *plVar29 = *plVar29 + -1;
                      }
LAB_0017e94b:
                      plVar36 = (*pplVar1)->ctx;
                      pcVar46 = "yin_parse_pattern";
                      goto LAB_0017f665;
                    }
                    if (stmt != LY_STMT_POSITION) {
                      if (stmt == LY_STMT_PREFIX) {
                        puVar39 = *pyVar37[1].dest;
                        lVar51 = LY_STMT_PREFIX;
                        arg_type = YIN_ARG_VALUE;
                        arg_val_type = Y_IDENTIF_ARG;
                        goto LAB_0017cf27;
                      }
                      if (stmt == LY_STMT_PRESENCE) {
                        puVar39 = *pyVar37[1].dest;
                        lVar51 = LY_STMT_PRESENCE;
                        goto LAB_0017cf1c;
                      }
                      if (stmt == LY_STMT_RANGE) {
                        pvVar24 = pyVar37[1].dest;
                        plVar22 = (lysp_restr *)calloc(1,0x40);
                        *(lysp_restr **)((long)pvVar24 + 8) = plVar22;
                        if (plVar22 == (lysp_restr *)0x0) {
                          plVar36 = (*pplVar1)->ctx;
                          pcVar46 = "yin_parse_range";
                          goto LAB_00180c43;
                        }
                        LVar16 = yin_parse_restriction(ctx,LY_STMT_RANGE,plVar22);
                        if (LVar16 != LY_SUCCESS) {
                          return LVar16;
                        }
                        pbVar2 = (byte *)((long)pvVar24 + 0x62);
                        *pbVar2 = *pbVar2 | 0x80;
                        goto LAB_0018018b;
                      }
                      if (stmt == LY_STMT_REFERENCE) goto LAB_0017b4ce;
                      if (stmt == LY_STMT_REFINE) {
                        plVar29 = (long *)pyVar37[1].dest;
                        lVar20 = *plVar29;
                        if (lVar20 == 0) {
                          plVar23 = (long *)malloc(0x58);
                          if (plVar23 != (long *)0x0) {
                            *plVar23 = 1;
                            goto LAB_0017e551;
                          }
                        }
                        else {
                          lVar43 = *(long *)(lVar20 + -8);
                          *(long *)(lVar20 + -8) = lVar43 + 1;
                          plVar23 = (long *)realloc((void *)(lVar20 + -8),lVar43 * 0x50 + 0x58);
                          if (plVar23 != (long *)0x0) {
LAB_0017e551:
                            *plVar29 = (long)(plVar23 + 1);
                            lVar20 = *plVar23;
                            plVar23[lVar20 * 10 + -1] = 0;
                            (plVar23 + lVar20 * 10 + -1)[1] = 0;
                            plVar23[lVar20 * 10 + -3] = 0;
                            (plVar23 + lVar20 * 10 + -3)[1] = 0;
                            plVar23[lVar20 * 10 + -5] = 0;
                            (plVar23 + lVar20 * 10 + -5)[1] = 0;
                            plVar23[lVar20 * 10 + -7] = 0;
                            (plVar23 + lVar20 * 10 + -7)[1] = 0;
                            plVar23[lVar20 * 10 + -9] = 0;
                            (plVar23 + lVar20 * 10 + -9)[1] = 0;
                            LVar16 = lyxml_ctx_next(*pplVar1);
                            if (LVar16 != LY_SUCCESS) {
                              return LVar16;
                            }
                            plVar31 = (lys_module *)(plVar23 + lVar20 * 10 + -9);
                            LVar16 = yin_parse_attribute(ctx,YIN_ARG_TARGET_NODE,(char **)plVar31,
                                                         Y_STR_ARG,LY_STMT_REFINE);
                            if (LVar16 != LY_SUCCESS) {
                              return LVar16;
                            }
                            if (*(char *)&(plVar31->ctx->dict).hash_tab == '\0') {
                              ly_log((ly_ctx *)
                                     **(undefined8 **)
                                       (ctx->parsed_mods->field_2).dnodes
                                       [ctx->parsed_mods->count - 1],LY_LLWRN,LY_SUCCESS,
                                     "Empty argument of %s statement does not make sense.","refine")
                              ;
                            }
                            plVar12 = local_68;
                            plStack_210 = (lys_module *)(plVar23 + lVar20 * 10);
                            _gr = (yin_subelement *)CONCAT44(uStack_214,0x50000);
                            local_208 = (char *)CONCAT62(local_208._2_6_,2);
                            local_200 = (char *)CONCAT44(local_200._4_4_,0x70000);
                            plStack_1f8 = (lys_module *)&plStack_210[-1].augmented_by;
                            local_1f0 = (lysc_module *)((ulong)local_1f0 & 0xffffffffffff0000);
                            local_1e8 = (lysc_ident *)CONCAT44(local_1e8._4_4_,0x80000);
                            plStack_1e0 = (lys_module *)&plStack_210[-1].dsc;
                            local_1d8 = (lys_module **)CONCAT62(local_1d8._2_6_,2);
                            local_1d0._0_4_ = 0x130000;
                            plStack_1c8 = (lys_module *)&plStack_210[-1].parsed;
                            local_1c0 = local_1c0 & 0xffffffffffff0000;
                            local_1b8 = CONCAT44(local_1b8._4_4_,0x180000);
                            local_1a8 = CONCAT62(local_1a8._2_6_,2);
                            local_1a0 = CONCAT44(local_1a0._4_4_,0x190000);
                            local_190 = CONCAT62(local_190._2_6_,2);
                            local_188 = CONCAT44(local_188._4_4_,0x1a0000);
                            local_178 = CONCAT62(local_178._2_6_,2);
                            local_170[0] = '\0';
                            local_170[1] = '\0';
                            local_170[2] = '\x1d';
                            local_170[3] = '\0';
                            plStack_168 = (lys_module *)&plStack_210[-1].compiled;
                            local_160 = 0;
                            local_158[0] = '\0';
                            local_158[1] = '\0';
                            local_158[2] = '%';
                            local_158[3] = '\0';
                            plStack_150 = (lys_module *)&plStack_210[-1].identities;
                            local_148 = 2;
                            local_140 = 0x270000;
                            local_138 = (lys_module *)&plStack_210[-1].ref;
                            local_130 = 2;
                            local_68->imports = (lysp_import *)0x0;
                            plVar12->mod = (lys_module *)0x0;
                            plVar12->revs = (lysp_revision *)0x0;
                            local_128._0_4_ = 0xf0000;
                            ppcVar25 = (char **)&plStack_210[-1].implemented;
                            sVar56 = 0xb;
                            lVar51 = LY_STMT_REFINE;
                            plStack_1b0 = plStack_210;
                            plStack_198 = plVar31;
                            plStack_180 = plVar31;
                            goto LAB_0017f403;
                          }
                          *(long *)(*plVar29 + -8) = *(long *)(*plVar29 + -8) + -1;
                        }
                        plVar36 = (*pplVar1)->ctx;
                        pcVar46 = "yin_parse_refine";
                        goto LAB_00180c43;
                      }
                      if (stmt != LY_STMT_REQUIRE_INSTANCE) {
                        if (stmt == LY_STMT_REVISION) {
                          plVar23 = (long *)pyVar37[1].dest;
                          temp_val = (char *)0x0;
                          lVar20 = *plVar23;
                          if (lVar20 == 0) {
                            plVar29 = (long *)malloc(0x30);
                            if (plVar29 != (long *)0x0) {
                              *plVar29 = 1;
                              goto LAB_0017ecbd;
                            }
                          }
                          else {
                            lVar43 = *(long *)(lVar20 + -8);
                            *(long *)(lVar20 + -8) = lVar43 + 1;
                            plVar29 = (long *)realloc((void *)(lVar20 + -8),lVar43 * 0x28 + 0x30);
                            if (plVar29 != (long *)0x0) {
LAB_0017ecbd:
                              *plVar23 = (long)(plVar29 + 1);
                              lVar20 = *plVar29;
                              plVar29[lVar20 * 5 + -2] = 0;
                              (plVar29 + lVar20 * 5 + -2)[1] = 0;
                              plVar29[lVar20 * 5 + -4] = 0;
                              (plVar29 + lVar20 * 5 + -4)[1] = 0;
                              plVar29[lVar20 * 5] = 0;
                              LVar16 = lyxml_ctx_next(*pplVar1);
                              if ((LVar16 != LY_SUCCESS) ||
                                 (LVar16 = yin_parse_attribute(ctx,YIN_ARG_DATE,&temp_val,Y_STR_ARG,
                                                               LY_STMT_REVISION), pcVar46 = temp_val
                                 , LVar16 != LY_SUCCESS)) break;
                              sVar26 = strlen(temp_val);
                              LVar16 = lysp_check_date((lysp_ctx *)ctx,pcVar46,sVar26,"revision");
                              if (LVar16 != LY_SUCCESS) goto LAB_0017ed3c;
                              pplVar52 = (lysp_ext_instance **)(plVar29 + lVar20 * 5);
                              plVar29 = plVar29 + lVar20 * 5 + -4;
                              *(undefined4 *)((long)plVar29 + 7) = *(undefined4 *)(temp_val + 7);
                              *plVar29 = *(long *)temp_val;
                              lydict_remove(ctx->xmlctx->ctx,temp_val);
                              plStack_210 = (lys_module *)(pplVar52 + -2);
                              local_208 = (char *)CONCAT62(local_208._2_6_,2);
                              plStack_1f8 = (lys_module *)(pplVar52 + -1);
                              local_1f0 = (lysc_module *)CONCAT62(local_1f0._2_6_,2);
                              local_1d8 = (lys_module **)0x0;
                              plStack_1e0 = (lys_module *)0x0;
                              local_1e8 = (lysc_ident *)0xf0000;
                              sVar56 = 3;
                              lVar51 = LY_STMT_REVISION;
                              goto LAB_0017ef2d;
                            }
                            *(long *)(*plVar23 + -8) = *(long *)(*plVar23 + -8) + -1;
                          }
                          plVar36 = (*pplVar1)->ctx;
                          pcVar46 = "yin_parse_revision";
                          goto LAB_0017f665;
                        }
                        if (stmt == LY_STMT_REVISION_DATE) {
                          puVar39 = (ushort *)pyVar37[1].dest;
                          local_208 = (char *)0x0;
                          _gr = (yin_subelement *)0xf0000;
                          plStack_210 = (lys_module *)0x0;
                          LVar16 = lyxml_ctx_next(*pplVar1);
                          if ((LVar16 == LY_SUCCESS) &&
                             (LVar16 = yin_parse_attribute(ctx,YIN_ARG_DATE,&temp_val,Y_STR_ARG,
                                                           LY_STMT_REVISION_DATE),
                             pcVar46 = temp_val, LVar16 == LY_SUCCESS)) {
                            sVar26 = strlen(temp_val);
                            LVar16 = lysp_check_date((lysp_ctx *)ctx,pcVar46,sVar26,"revision-date")
                            ;
                            pcVar46 = temp_val;
                            if (LVar16 != LY_SUCCESS) goto LAB_0017ed3c;
                            strcpy((char *)puVar39,temp_val);
                            lydict_remove(ctx->xmlctx->ctx,pcVar46);
                            sVar56 = 1;
                            lVar51 = LY_STMT_REVISION_DATE;
                            goto LAB_0018016e;
                          }
                        }
                        else if (stmt == LY_STMT_STATUS) {
                          puVar39 = (ushort *)pyVar37[1].dest;
                          temp_val = (char *)0x0;
                          local_208 = (char *)0x0;
                          _gr = (yin_subelement *)0xf0000;
                          plStack_210 = (lys_module *)0x0;
                          LVar16 = lyxml_ctx_next(*pplVar1);
                          if ((LVar16 == LY_SUCCESS) &&
                             (LVar16 = yin_parse_attribute(ctx,YIN_ARG_VALUE,&temp_val,Y_STR_ARG,
                                                           LY_STMT_STATUS), pcVar46 = temp_val,
                             LVar16 == LY_SUCCESS)) {
                            iVar18 = strcmp(temp_val,"current");
                            if (iVar18 == 0) {
                              uVar15 = 4;
                            }
                            else {
                              iVar18 = strcmp(pcVar46,"deprecated");
                              if (iVar18 == 0) {
                                uVar15 = 8;
                              }
                              else {
                                iVar18 = strcmp(pcVar46,"obsolete");
                                if (iVar18 != 0) {
                                  plVar36 = (ly_ctx *)
                                            **(undefined8 **)
                                              (ctx->parsed_mods->field_2).dnodes
                                              [ctx->parsed_mods->count - 1];
                                  pcVar38 = 
                                  "Invalid value \"%s\" of \"%s\" attribute in \"%s\" element. Valid values are \"%s\", \"%s\" and \"%s\"."
                                  ;
                                  pcVar55 = "deprecated";
                                  pcVar54 = "current";
                                  pcVar48 = "status";
                                  goto LAB_0017d4fa;
                                }
                                uVar15 = 0x10;
                              }
                            }
                            *puVar39 = *puVar39 | uVar15;
                            lydict_remove(ctx->xmlctx->ctx,pcVar46);
                            sVar56 = 1;
                            lVar51 = LY_STMT_STATUS;
                            goto LAB_0018016e;
                          }
                        }
                        else if (stmt == LY_STMT_TYPE) {
                          if (parent_stmt == LY_STMT_DEVIATE) {
                            pvVar24 = calloc(1,0x68);
                            *(void **)pyVar37[1].dest = pvVar24;
                            plVar21 = *pyVar37[1].dest;
                            if (*pyVar37[1].dest == (lys_module *)0x0) goto LAB_00180c2b;
                          }
                          else {
                            plVar31 = (lys_module *)pyVar37[1].dest;
                            plVar21 = plVar31;
                            if (parent_stmt == LY_STMT_TYPE) {
                              pcVar46 = plVar31->dsc;
                              if (pcVar46 == (char *)0x0) {
                                plVar29 = (long *)malloc(0x70);
                                if (plVar29 != (long *)0x0) {
                                  *plVar29 = 1;
                                  goto LAB_0017f70f;
                                }
                              }
                              else {
                                lVar20 = *(long *)(pcVar46 + -8);
                                *(long *)(pcVar46 + -8) = lVar20 + 1;
                                plVar29 = (long *)realloc(pcVar46 + -8,lVar20 * 0x68 + 0x70);
                                if (plVar29 != (long *)0x0) {
LAB_0017f70f:
                                  plVar31->dsc = (char *)(plVar29 + 1);
                                  plVar29 = plVar29 + *plVar29 * 0xd;
                                  plVar21 = (lys_module *)(plVar29 + -0xc);
                                  plVar29[-2] = 0;
                                  plVar29[-1] = 0;
                                  plVar29[-4] = 0;
                                  plVar29[-3] = 0;
                                  plVar29[-6] = 0;
                                  plVar29[-5] = 0;
                                  plVar29[-8] = 0;
                                  plVar29[-7] = 0;
                                  plVar29[-10] = 0;
                                  plVar29[-9] = 0;
                                  plVar21->ctx = (ly_ctx *)0x0;
                                  plVar29[-0xb] = 0;
                                  *plVar29 = 0;
                                  pbVar2 = (byte *)((long)&plVar31->identities + 3);
                                  *pbVar2 = *pbVar2 | 1;
                                  goto LAB_0017f748;
                                }
                                *(long *)(plVar31->dsc + -8) = *(long *)(plVar31->dsc + -8) + -1;
                              }
LAB_00180c2b:
                              plVar36 = (*pplVar1)->ctx;
                              pcVar46 = "yin_parse_type";
                              goto LAB_00180c43;
                            }
                          }
LAB_0017f748:
                          plVar12 = local_68;
                          plVar21->parsed =
                               (lysp_module *)
                               (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                          _gr = (yin_subelement *)CONCAT44(uStack_214,0x20000);
                          local_208 = (char *)((ulong)local_208 & 0xffffffffffff0000);
                          local_200 = (char *)CONCAT44(local_200._4_4_,0x40000);
                          local_1f0 = (lysc_module *)((ulong)local_1f0 & 0xffffffffffff0000);
                          local_1e8 = (lysc_ident *)CONCAT44(local_1e8._4_4_,0xb0000);
                          local_1d8 = (lys_module **)((ulong)local_1d8 & 0xffffffffffff0000);
                          local_1d0._0_4_ = 0x110000;
                          local_1c0 = CONCAT62(local_1c0._2_6_,2);
                          local_1b8 = CONCAT44(local_1b8._4_4_,0x170000);
                          local_1a8 = CONCAT62(local_1a8._2_6_,2);
                          local_1a0 = CONCAT44(local_1a0._4_4_,0x210000);
                          local_190 = CONCAT62(local_190._2_6_,2);
                          local_188 = CONCAT44(local_188._4_4_,0x220000);
                          local_178 = local_178 & 0xffffffffffff0000;
                          local_170[0] = '\0';
                          local_170[1] = '\0';
                          local_170[2] = '&';
                          local_170[3] = '\0';
                          local_160 = 2;
                          local_158[0] = '\0';
                          local_158[1] = '\0';
                          local_158[2] = ')';
                          local_158[3] = '\0';
                          local_148 = 2;
                          local_140 = 0x2e0000;
                          local_130 = 0;
                          local_68->imports = (lysp_import *)0x0;
                          plVar12->mod = (lys_module *)0x0;
                          plVar12->revs = (lysp_revision *)0x0;
                          local_128._0_4_ = 0xf0000;
                          plStack_210 = plVar21;
                          plStack_1f8 = plVar21;
                          plStack_1e0 = plVar21;
                          plStack_1c8 = plVar21;
                          plStack_1b0 = plVar21;
                          plStack_198 = plVar21;
                          plStack_180 = plVar21;
                          plStack_168 = plVar21;
                          plStack_150 = plVar21;
                          local_138 = plVar21;
                          LVar16 = lyxml_ctx_next(ctx->xmlctx);
                          if ((LVar16 == LY_SUCCESS) &&
                             (LVar16 = yin_parse_attribute(ctx,YIN_ARG_NAME,(char **)plVar21,
                                                           Y_PREF_IDENTIF_ARG,LY_STMT_TYPE),
                             LVar16 == LY_SUCCESS)) {
                            pplVar52 = (lysp_ext_instance **)&plVar21->ref;
                            LVar16 = yin_parse_content(ctx,(yin_subelement *)&gr,0xb,plVar21,
                                                       LY_STMT_TYPE,(char **)0x0,pplVar52);
                            if (LVar16 == LY_SUCCESS) goto LAB_0017e508;
                          }
                        }
                        else {
                          if (stmt == LY_STMT_TYPEDEF) {
                            puVar49 = (undefined8 *)pyVar37[1].dest;
                            plVar29 = (long *)puVar49[1];
                            lVar20 = *plVar29;
                            if (lVar20 == 0) {
                              plVar23 = (long *)malloc(0xb8);
                              if (plVar23 != (long *)0x0) {
                                *plVar23 = 1;
                                goto LAB_0017e98e;
                              }
                            }
                            else {
                              lVar43 = *(long *)(lVar20 + -8);
                              *(long *)(lVar20 + -8) = lVar43 + 1;
                              plVar23 = (long *)realloc((void *)(lVar20 + -8),lVar43 * 0xb0 + 0xb8);
                              if (plVar23 != (long *)0x0) {
LAB_0017e98e:
                                *plVar29 = (long)(plVar23 + 1);
                                lVar20 = *plVar23;
                                ppcVar25 = (char **)(plVar23 + lVar20 * 0x16 + -0x15);
                                memset(ppcVar25,0,0xb0);
                                LVar16 = lyxml_ctx_next(*pplVar1);
                                if (LVar16 != LY_SUCCESS) {
                                  return LVar16;
                                }
                                LVar16 = yin_parse_attribute(ctx,YIN_ARG_NAME,ppcVar25,Y_IDENTIF_ARG
                                                             ,LY_STMT_TYPEDEF);
                                if (LVar16 != LY_SUCCESS) {
                                  return LVar16;
                                }
                                plStack_1c8 = (lys_module *)(plVar23 + lVar20 * 0x16);
                                _gr = (yin_subelement *)CONCAT44(uStack_214,0x70000);
                                plStack_210 = (lys_module *)&plStack_1c8[-2].augmented_by;
                                local_208 = (char *)CONCAT62(local_208._2_6_,2);
                                local_200 = (char *)CONCAT44(local_200._4_4_,0x80000);
                                plStack_1f8 = plStack_1c8 + -1;
                                local_1f0 = (lysc_module *)CONCAT62(local_1f0._2_6_,2);
                                local_1e8 = (lysc_ident *)CONCAT44(local_1e8._4_4_,0x270000);
                                plStack_1e0 = (lys_module *)&plStack_1c8[-1].name;
                                local_1d8 = (lys_module **)CONCAT62(local_1d8._2_6_,2);
                                local_1d0._0_4_ = 0x2c0000;
                                local_1c0 = CONCAT62(local_1c0._2_6_,2);
                                local_1b8 = CONCAT44(local_1b8._4_4_,0x2e0000);
                                plStack_1b0 = (lys_module *)&plStack_1c8[-1].ns;
                                local_1a8 = CONCAT62(local_1a8._2_6_,3);
                                local_1a0 = CONCAT44(local_1a0._4_4_,0x310000);
                                plStack_198 = (lys_module *)&plStack_1c8[-2].identities;
                                local_190 = CONCAT62(local_190._2_6_,2);
                                local_178 = 0;
                                plStack_180 = (lys_module *)0x0;
                                local_188 = 0xf0000;
                                plVar31 = plStack_1c8 + -1;
                                LVar16 = yin_parse_content(ctx,(yin_subelement *)&gr,7,ppcVar25,
                                                           LY_STMT_TYPEDEF,(char **)0x0,
                                                           (lysp_ext_instance **)&plVar31->revision)
                                ;
                                if ((LVar16 != LY_SUCCESS) ||
                                   (LVar16 = yin_unres_exts_add(ctx,(lysp_ext_instance *)
                                                                    plVar31->revision),
                                   LVar16 != LY_SUCCESS)) break;
                                pvVar24 = (void *)*puVar49;
                                if (pvVar24 != (void *)0x0) {
                                  if (ctx->main_ctx == (lysp_ctx *)0x0) {
                                    __assert_fail("ctx->main_ctx",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yin.c"
                                                  ,0x6b4,
                                                  "LY_ERR yin_parse_typedef(struct lysp_yin_ctx *, struct tree_node_meta *)"
                                                 );
                                  }
                                  LVar16 = ly_set_add(&ctx->main_ctx->tpdfs_nodes,pvVar24,'\0',
                                                      (uint32_t *)0x0);
                                  if (LVar16 != LY_SUCCESS) break;
                                }
                                goto LAB_001804af;
                              }
                              *(long *)(*plVar29 + -8) = *(long *)(*plVar29 + -8) + -1;
                            }
                            plVar36 = (*pplVar1)->ctx;
                            pcVar46 = "yin_parse_typedef";
                            goto LAB_00180c43;
                          }
                          if (stmt == LY_STMT_UNIQUE) goto LAB_0017d354;
                          if (stmt == LY_STMT_UNITS) {
                            lVar51 = LY_STMT_UNITS;
                            arg_type = YIN_ARG_NAME;
                            puVar39 = *pyVar37[1].dest;
                            goto LAB_0017cf21;
                          }
                          if (stmt == LY_STMT_VALUE) goto LAB_0017b780;
                          if (stmt == LY_STMT_WHEN) {
                            puVar49 = (undefined8 *)pyVar37[1].dest;
                            ppcVar25 = (char **)calloc(1,0x20);
                            if (ppcVar25 == (char **)0x0) {
                              plVar36 = (*pplVar1)->ctx;
                              pcVar46 = "yin_parse_when";
                              goto LAB_00180c43;
                            }
                            LVar16 = lyxml_ctx_next(*pplVar1);
                            if ((LVar16 != LY_SUCCESS) ||
                               (LVar16 = yin_parse_attribute(ctx,YIN_ARG_CONDITION,ppcVar25,
                                                             Y_STR_ARG,LY_STMT_WHEN),
                               LVar16 != LY_SUCCESS)) {
                              free(ppcVar25);
                              return LVar16;
                            }
                            *puVar49 = ppcVar25;
                            _gr = (yin_subelement *)CONCAT44(uStack_214,0x80000);
                            plStack_210 = (lys_module *)(ppcVar25 + 1);
                            local_208 = (char *)CONCAT62(local_208._2_6_,2);
                            local_200 = (char *)CONCAT44(local_200._4_4_,0x270000);
                            plStack_1f8 = (lys_module *)(ppcVar25 + 2);
                            local_1f0 = (lysc_module *)CONCAT62(local_1f0._2_6_,2);
                            local_1d8 = (lys_module **)0x0;
                            plStack_1e0 = (lys_module *)0x0;
                            local_1e8 = (lysc_ident *)0xf0000;
                            pplVar52 = (lysp_ext_instance **)(ppcVar25 + 3);
                            sVar56 = 3;
                            lVar51 = LY_STMT_WHEN;
                            goto LAB_0017c9a8;
                          }
                          if (stmt == LY_STMT_YANG_VERSION) {
                            puVar35 = (undefined1 *)pyVar37[1].dest;
                            temp_val = (char *)0x0;
                            local_208 = (char *)0x0;
                            _gr = (yin_subelement *)0xf0000;
                            plStack_210 = (lys_module *)0x0;
                            LVar16 = lyxml_ctx_next(*pplVar1);
                            if ((LVar16 == LY_SUCCESS) &&
                               (LVar16 = yin_parse_attribute(ctx,YIN_ARG_VALUE,&temp_val,Y_STR_ARG,
                                                             LY_STMT_YANG_VERSION),
                               pcVar46 = temp_val, LVar16 == LY_SUCCESS)) {
                              if ((*temp_val == '1') && (temp_val[1] == '\0')) {
                                uVar14 = 1;
                              }
                              else {
                                iVar18 = strcmp(temp_val,"1.1");
                                if (iVar18 != 0) {
                                  plVar36 = (ly_ctx *)
                                            **(undefined8 **)
                                              (ctx->parsed_mods->field_2).dnodes
                                              [ctx->parsed_mods->count - 1];
                                  pcVar38 = 
                                  "Invalid value \"%s\" of \"%s\" attribute in \"%s\" element. Valid values are \"%s\" and \"%s\"."
                                  ;
                                  pcVar55 = "1.1";
                                  pcVar54 = "1";
                                  pcVar48 = "yang-version";
                                  goto LAB_0017d4fa;
                                }
                                uVar14 = 2;
                              }
                              *puVar35 = uVar14;
                              lydict_remove(ctx->xmlctx->ctx,temp_val);
                              sVar56 = 1;
                              puVar39 = (ushort *)local_128._96_8_;
                              lVar51 = LY_STMT_YANG_VERSION;
                              goto LAB_0018016e;
                            }
                          }
                          else {
                            if (stmt != LY_STMT_EXTENSION_INSTANCE) goto switchD_0017b2d7_caseD_3;
                            if ((uint64_t *)pyVar37[1].dest == (uint64_t *)0x0) {
                              parent_stmt_index = 0;
                            }
                            else {
                              parent_stmt_index = *pyVar37[1].dest;
                            }
                            LVar16 = yin_parse_extension_instance
                                               (ctx,(void *)local_128._96_8_,parent_stmt,
                                                parent_stmt_index,exts);
                          }
                        }
                        break;
                      }
                      pvVar24 = pyVar37[1].dest;
                      temp_val = (char *)0x0;
                      local_208 = (char *)0x0;
                      _gr = (yin_subelement *)0xf0000;
                      plStack_210 = (lys_module *)0x0;
                      *(byte *)((long)pvVar24 + 99) = *(byte *)((long)pvVar24 + 99) | 2;
                      LVar16 = lyxml_ctx_next(*pplVar1);
                      if ((LVar16 != LY_SUCCESS) ||
                         (LVar16 = yin_parse_attribute(ctx,YIN_ARG_VALUE,&temp_val,Y_STR_ARG,
                                                       LY_STMT_REQUIRE_INSTANCE), pcVar46 = temp_val
                         , LVar16 != LY_SUCCESS)) break;
                      iVar18 = strcmp(temp_val,"true");
                      if (iVar18 == 0) {
                        *(undefined1 *)((long)pvVar24 + 0x61) = 1;
LAB_0017f945:
                        lydict_remove(ctx->xmlctx->ctx,pcVar46);
                        pplVar52 = (lysp_ext_instance **)((long)pvVar24 + 0x48);
                        LVar16 = yin_parse_content(ctx,(yin_subelement *)&gr,1,pvVar24,
                                                   LY_STMT_REQUIRE_INSTANCE,(char **)0x0,pplVar52);
                        if (LVar16 == LY_SUCCESS) goto LAB_0017c9be;
                        break;
                      }
                      iVar18 = strcmp(pcVar46,"false");
                      if (iVar18 == 0) goto LAB_0017f945;
                      plVar36 = (ly_ctx *)
                                **(undefined8 **)
                                  (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                      pcVar38 = 
                      "Invalid value \"%s\" of \"%s\" attribute in \"%s\" element. Valid values are \"%s\" and \"%s\"."
                      ;
                      pcVar55 = "false";
                      pcVar54 = "true";
                      pcVar48 = "require-instance";
LAB_0017d4fa:
                      ly_vlog(plVar36,(char *)0x0,LYVE_SYNTAX_YIN,pcVar38,pcVar46,"value",pcVar48,
                              pcVar54,pcVar55);
                      goto LAB_0017d505;
                    }
LAB_0017b780:
                    pvVar24 = pyVar37[1].dest;
                    temp_val = (char *)0x0;
                    if ((stmt != LY_STMT_POSITION) && (stmt != LY_STMT_VALUE)) {
                      __assert_fail("parent_stmt == LY_STMT_POSITION || parent_stmt == LY_STMT_VALUE"
                                    ,
                                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yin.c"
                                    ,0x472,
                                    "LY_ERR yin_parse_value_pos(struct lysp_yin_ctx *, enum ly_stmt, struct lysp_type_enum *)"
                                   );
                    }
                    *(byte *)((long)pvVar24 + 0x31) = *(byte *)((long)pvVar24 + 0x31) | 2;
                    LVar19 = lyxml_ctx_next(*pplVar1);
                    if ((LVar19 != LY_SUCCESS) ||
                       (LVar19 = yin_parse_attribute(ctx,YIN_ARG_VALUE,&temp_val,Y_STR_ARG,stmt),
                       pcVar46 = temp_val, LVar19 != LY_SUCCESS)) goto LAB_0017e051;
                    if ((temp_val == (char *)0x0) ||
                       ((cVar6 = *temp_val, cVar6 == '\0' || (cVar6 == '+')))) {
LAB_0017b801:
                      plVar36 = (ly_ctx *)
                                **(undefined8 **)
                                  (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                      pcVar48 = lyplg_ext_stmt2str(stmt);
                      pcVar38 = "Invalid value \"%s\" of \"%s\" attribute in \"%s\" element.";
                    }
                    else {
                      if (cVar6 == '0') {
                        if (temp_val[1] != '\0') goto LAB_0017b801;
                      }
                      else if (((cVar6 == '-' && stmt == LY_STMT_POSITION) && (temp_val[1] == '0'))
                              && (temp_val[2] == '\0')) goto LAB_0017b801;
                      piVar33 = __errno_location();
                      *piVar33 = 0;
                      if (stmt == LY_STMT_VALUE) {
                        uVar34 = strtoll(pcVar46,&ptr,10);
                        if ((long)(int)uVar34 == uVar34) {
LAB_0018002c:
                          pcVar46 = temp_val;
                          if (*ptr == '\0') {
                            if (*piVar33 != 0x22) {
                              *(ulonglong *)((long)pvVar24 + 0x18) = uVar34;
                              local_208 = (char *)0x0;
                              _gr = (yin_subelement *)0xf0000;
                              plStack_210 = (lys_module *)0x0;
                              LVar19 = yin_parse_content(ctx,(yin_subelement *)&gr,1,pvVar24,stmt,
                                                         (char **)0x0,
                                                         (lysp_ext_instance **)
                                                         ((long)pvVar24 + 0x28));
                              if (LVar19 == LY_SUCCESS) {
                                LVar19 = yin_unres_exts_add(ctx,*(lysp_ext_instance **)
                                                                 ((long)pvVar24 + 0x28));
                              }
                              goto LAB_0017e051;
                            }
                            plVar36 = (ly_ctx *)
                                      **(undefined8 **)
                                        (ctx->parsed_mods->field_2).dnodes
                                        [ctx->parsed_mods->count - 1];
                            pcVar48 = lyplg_ext_stmt2str(stmt);
                            pcVar38 = 
                            "Value \"%s\" of \"%s\" attribute in \"%s\" element is out of bounds.";
                            goto LAB_0017f6e3;
                          }
                          goto LAB_0018003d;
                        }
                        plVar36 = (ly_ctx *)
                                  **(undefined8 **)
                                    (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                        lVar51 = LY_STMT_VALUE;
                      }
                      else {
                        uVar34 = strtoull(pcVar46,&ptr,10);
                        if (uVar34 >> 0x20 == 0) goto LAB_0018002c;
LAB_0018003d:
                        plVar36 = (ly_ctx *)
                                  **(undefined8 **)
                                    (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                        lVar51 = stmt;
                      }
                      pcVar46 = temp_val;
                      pcVar48 = lyplg_ext_stmt2str(lVar51);
                      pcVar38 = "Invalid value \"%s\" of \"%s\" attribute in \"%s\" element.";
                    }
LAB_0017f6e3:
                    ly_vlog(plVar36,(char *)0x0,LYVE_SYNTAX_YIN,pcVar38,pcVar46,"value",pcVar48);
                    LVar19 = LY_EVALID;
                  }
LAB_0017e051:
                  lydict_remove((*pplVar1)->ctx,temp_val);
                  goto LAB_00180182;
                }
                plVar29 = (long *)pyVar37[1].dest;
                local_238 = (lysp_ext_instance **)0x0;
                aStack_230.dnodes = (lyd_node **)0x0;
                plStack_240 = (lys_module *)0x0;
                temp_val = (char *)**(undefined8 **)
                                     (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1]
                ;
                lVar20 = *plVar29;
                if (lVar20 == 0) {
                  plVar23 = (long *)malloc(0x30);
                  if (plVar23 != (long *)0x0) {
                    *plVar23 = 1;
                    goto LAB_0017f4a1;
                  }
                }
                else {
                  lVar43 = *(long *)(lVar20 + -8);
                  *(long *)(lVar20 + -8) = lVar43 + 1;
                  plVar23 = (long *)realloc((void *)(lVar20 + -8),lVar43 * 0x28 + 0x30);
                  if (plVar23 != (long *)0x0) {
LAB_0017f4a1:
                    *plVar29 = (long)(plVar23 + 1);
                    lVar20 = *plVar23;
                    plVar5 = plVar23 + lVar20 * 5;
                    dev = (lysp_deviation *)(plVar5 + -4);
                    plVar5[-2] = 0;
                    plVar5[-1] = 0;
                    dev->nodeid = (char *)0x0;
                    plVar5[-3] = 0;
                    *plVar5 = 0;
                    LVar19 = lyxml_ctx_next(*pplVar1);
                    if ((LVar19 != LY_SUCCESS) ||
                       (LVar19 = yin_parse_attribute(ctx,YIN_ARG_TARGET_NODE,(char **)dev,Y_STR_ARG,
                                                     LY_STMT_DEVIATION), LVar19 != LY_SUCCESS)) {
LAB_0017f5f2:
                      lysp_deviation_free((lysf_ctx *)&temp_val,dev);
                      lVar20 = *plVar29;
                      plVar23 = (long *)(lVar20 + -8);
                      *plVar23 = *plVar23 + -1;
                      if (*plVar23 == 0) {
                        free((void *)(lVar20 + -8));
                        *plVar29 = 0;
                      }
                      goto LAB_00180182;
                    }
                    if (*dev->nodeid == '\0') {
                      ly_log((ly_ctx *)
                             **(undefined8 **)
                               (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1],
                             LY_LLWRN,LY_SUCCESS,
                             "Empty argument of %s statement does not make sense.","deviation");
                    }
                    pplVar52 = (lysp_ext_instance **)(plVar23 + lVar20 * 5);
                    _gr = (yin_subelement *)CONCAT44(uStack_214,0x80000);
                    plStack_210 = (lys_module *)(pplVar52 + -3);
                    local_208 = (char *)CONCAT62(local_208._2_6_,2);
                    local_200 = (char *)CONCAT44(local_200._4_4_,0x90000);
                    plStack_1f8 = (lys_module *)(pplVar52 + -1);
                    local_1f0 = (lysc_module *)CONCAT62(local_1f0._2_6_,1);
                    local_1e8 = (lysc_ident *)CONCAT44(local_1e8._4_4_,0x270000);
                    plStack_1e0 = (lys_module *)(pplVar52 + -2);
                    local_1d8 = (lys_module **)CONCAT62(local_1d8._2_6_,2);
                    local_1c0 = 0;
                    plStack_1c8 = (lys_module *)0x0;
                    local_1d0._0_1_ = '\0';
                    local_1d0._1_1_ = '\0';
                    local_1d0._2_1_ = '\x0f';
                    local_1d0._3_5_ = 0;
                    LVar19 = yin_parse_content(ctx,(yin_subelement *)&gr,4,dev,LY_STMT_DEVIATION,
                                               (char **)0x0,pplVar52);
                    if ((LVar19 != LY_SUCCESS) ||
                       (LVar19 = yin_unres_exts_add(ctx,*pplVar52), LVar19 != LY_SUCCESS))
                    goto LAB_0017f5f2;
                    goto LAB_001804af;
                  }
                  *(long *)(*plVar29 + -8) = *(long *)(*plVar29 + -8) + -1;
                }
                plVar36 = (*pplVar1)->ctx;
                pcVar46 = "yin_parse_deviation";
                goto LAB_0017f665;
              }
              lVar51 = LY_STMT_DEFAULT;
LAB_0017d354:
              LVar16 = yin_parse_qname(ctx,lVar51,pyVar44,exts);
            }
            break;
          }
          values = (char ***)pyVar37[1].dest;
          if (parent_stmt != LY_STMT_IDENTITY) {
            if (parent_stmt != LY_STMT_TYPE) {
              plVar36 = (*pplVar1)->ctx;
              uVar47 = 900;
              goto LAB_00180c17;
            }
            LVar16 = yin_parse_simple_elements
                               (ctx,LY_STMT_BASE,values + 7,YIN_ARG_NAME,Y_PREF_IDENTIF_ARG,exts);
            if (LVar16 != LY_SUCCESS) {
              return LVar16;
            }
            *(byte *)((long)values + 0x62) = *(byte *)((long)values + 0x62) | 1;
            goto LAB_0018018b;
          }
          LVar16 = yin_parse_simple_elements
                             (ctx,LY_STMT_BASE,values,YIN_ARG_NAME,Y_PREF_IDENTIF_ARG,exts);
LAB_0017e190:
          if (LVar16 != LY_SUCCESS) {
            return LVar16;
          }
          goto LAB_0018018b;
        }
        LVar19 = LVar16;
LAB_00180182:
        if (LVar19 != LY_SUCCESS) {
          return LVar19;
        }
LAB_0018018b:
        LVar16 = lyxml_ctx_next(*pplVar1);
        lVar51 = stmt;
        if (LVar16 != LY_SUCCESS) {
          return LVar16;
        }
      }
      goto LAB_00180646;
    }
  }
  LVar16 = yin_validate_value(ctx,Y_STR_ARG);
  if (LVar16 != LY_SUCCESS) {
    return LVar16;
  }
  if (text_content != (char **)0x0) {
    plVar30 = *pplVar1;
    if ((plVar30->field_6).dynamic == '\0') {
      if ((plVar30->field_4).prefix_len == 0) {
        pcVar46 = "";
      }
      else {
        pcVar46 = (plVar30->field_3).prefix;
      }
      LVar16 = lydict_insert(plVar30->ctx,pcVar46,(plVar30->field_4).prefix_len,text_content);
    }
    else {
      LVar16 = lydict_insert_zc(plVar30->ctx,(plVar30->field_3).prefix,text_content);
    }
    if (LVar16 != LY_SUCCESS) {
      return LVar16;
    }
    ((*pplVar1)->field_6).dynamic = '\0';
    if (*text_content == (char *)0x0) {
      return LY_EMEM;
    }
  }
  LVar16 = lyxml_ctx_next(*pplVar1);
  if (LVar16 != LY_SUCCESS) {
    return LVar16;
  }
  bVar13 = 0;
  if ('\0' < (char)bVar50) {
    bVar13 = bVar50;
  }
  pplVar53 = (lys_module **)(ulong)bVar13;
LAB_00180646:
  lVar20 = -0x18;
  do {
    lVar43 = lVar20;
    if ((long)pplVar53 * 0x18 - (lVar43 + 0x18) == 0) {
      return LY_SUCCESS;
    }
    lVar20 = lVar43 + 0x18;
  } while ((*(ushort *)((long)&local_a0[1].flags + lVar43) & 0x81) != 1);
  if (ctx == (lysp_yin_ctx *)0x0) {
    plVar41 = (ly_ctx *)0x0;
  }
  else {
    plVar41 = (ly_ctx *)
              **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
  }
  plVar36 = (ly_ctx *)lyplg_ext_stmt2str(*(ly_stmt *)((long)&local_a0[1].type + lVar43));
  pcVar46 = lyplg_ext_stmt2str(parent_stmt);
  pcVar38 = "Missing mandatory sub-element \"%s\" of \"%s\" element.";
LAB_0018073e:
  LVar40 = LYVE_SYNTAX_YIN;
LAB_0018074c:
  ly_vlog(plVar41,(char *)0x0,LVar40,pcVar38,plVar36,pcVar46);
  return LY_EVALID;
}

Assistant:

LY_ERR
yin_parse_content(struct lysp_yin_ctx *ctx, struct yin_subelement *subelem_info, size_t subelem_info_size,
        const void *parent, enum ly_stmt parent_stmt, const char **text_content, struct lysp_ext_instance **exts)
{
    LY_ERR ret = LY_SUCCESS;
    enum LYXML_PARSER_STATUS next_status;
    enum ly_stmt cur_stmt = LY_STMT_NONE, last_stmt = LY_STMT_NONE;
    struct yin_subelement *subelem = NULL;

    assert(ctx->xmlctx->status == LYXML_ELEM_CONTENT);

    if (ctx->xmlctx->ws_only) {
        /* check whether there are any children */
        LY_CHECK_GOTO(ret = lyxml_ctx_peek(ctx->xmlctx, &next_status), cleanup);
    } else {
        /* we want to parse the value */
        next_status = LYXML_ELEM_CLOSE;
    }

    if (next_status == LYXML_ELEMENT) {
        LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);

        /* current element has subelements as content */
        while (ctx->xmlctx->status == LYXML_ELEMENT) {
            /* match keyword */
            last_stmt = cur_stmt;
            cur_stmt = yin_match_keyword(ctx, ctx->xmlctx->name, ctx->xmlctx->name_len, ctx->xmlctx->prefix,
                    ctx->xmlctx->prefix_len, parent_stmt);

            /* check if this element can be child of current element */
            subelem = get_record(cur_stmt, subelem_info_size, subelem_info);
            if (!subelem) {
                if ((parent_stmt == LY_STMT_DEVIATE) && isdevsub(cur_stmt)) {
                    LOGVAL_PARSER((struct lysp_ctx *)ctx, LY_VCODE_INDEV_YIN, lyplg_ext_stmt2str(cur_stmt));
                } else {
                    LOGVAL_PARSER((struct lysp_ctx *)ctx, LY_VCODE_UNEXP_SUBELEM, (int)ctx->xmlctx->name_len,
                            ctx->xmlctx->name, lyplg_ext_stmt2str(parent_stmt));
                }
                ret = LY_EVALID;
                goto cleanup;
            }

            /* relative order is required only in module and submodule sub-elements */
            if ((parent_stmt == LY_STMT_MODULE) || (parent_stmt == LY_STMT_SUBMODULE)) {
                ret = yin_check_relative_order(ctx, last_stmt, cur_stmt, parent_stmt);
                LY_CHECK_GOTO(ret, cleanup);
            }

            /* flag check */
            if ((subelem->flags & YIN_SUBELEM_UNIQUE) && (subelem->flags & YIN_SUBELEM_PARSED)) {
                /* subelement uniquenes */
                LOGVAL_PARSER((struct lysp_ctx *)ctx, LY_VCODE_SUBELEM_REDEF, lyplg_ext_stmt2str(cur_stmt), lyplg_ext_stmt2str(parent_stmt));
                return LY_EVALID;
            }
            if (subelem->flags & YIN_SUBELEM_FIRST) {
                /* subelement is supposed to be defined as first subelement */
                ret = yin_check_subelem_first_constraint(ctx, subelem_info, subelem_info_size, parent_stmt, subelem);
                LY_CHECK_GOTO(ret, cleanup);
            }
            if (subelem->flags & YIN_SUBELEM_VER2) {
                /* subelement is supported only in version 1.1 or higher */
                if (PARSER_CUR_PMOD(ctx)->version < LYS_VERSION_1_1) {
                    LOGVAL_PARSER((struct lysp_ctx *)ctx, LY_VCODE_INSUBELEM2, lyplg_ext_stmt2str(cur_stmt), lyplg_ext_stmt2str(parent_stmt));
                    ret = LY_EVALID;
                    goto cleanup;
                }
            }
            /* note that element was parsed for easy uniqueness check in next iterations */
            subelem->flags |= YIN_SUBELEM_PARSED;

            switch (cur_stmt) {
            /* call responsible function */
            case LY_STMT_EXTENSION_INSTANCE:
                ret = yin_parse_extension_instance(ctx, parent, parent_stmt,
                        (subelem->dest) ? *((LY_ARRAY_COUNT_TYPE *)subelem->dest) : 0, exts);
                break;
            case LY_STMT_ACTION:
            case LY_STMT_RPC:
                ret = yin_parse_action(ctx, (struct tree_node_meta *)subelem->dest);
                break;
            case LY_STMT_ANYDATA:
            case LY_STMT_ANYXML:
                ret = yin_parse_any(ctx, cur_stmt, (struct tree_node_meta *)subelem->dest);
                break;
            case LY_STMT_ARGUMENT:
                ret = yin_parse_argument(ctx, parent, (struct yin_argument_meta *)subelem->dest, exts);
                break;
            case LY_STMT_AUGMENT:
                ret = yin_parse_augment(ctx, (struct tree_node_meta *)subelem->dest);
                break;
            case LY_STMT_BASE:
                ret = yin_parse_base(ctx, parent_stmt, subelem->dest, exts);
                break;
            case LY_STMT_BELONGS_TO:
                ret = yin_parse_belongs_to(ctx, (struct lysp_submodule *)subelem->dest, exts);
                break;
            case LY_STMT_BIT:
                ret = yin_parse_bit(ctx, (struct lysp_type *)subelem->dest);
                break;
            case LY_STMT_CASE:
                ret = yin_parse_case(ctx, (struct tree_node_meta *)subelem->dest);
                break;
            case LY_STMT_CHOICE:
                ret = yin_parse_choice(ctx, (struct tree_node_meta *)subelem->dest);
                break;
            case LY_STMT_CONFIG:
                ret = yin_parse_config(ctx, (uint16_t *)subelem->dest, exts);
                break;
            case LY_STMT_CONTACT:
            case LY_STMT_DESCRIPTION:
            case LY_STMT_ORGANIZATION:
            case LY_STMT_REFERENCE:
                ret = yin_parse_meta(ctx, parent, cur_stmt, (const char **)subelem->dest, exts);
                break;
            case LY_STMT_CONTAINER:
                ret = yin_parse_container(ctx, (struct tree_node_meta *)subelem->dest);
                break;
            case LY_STMT_DEFAULT:
                ret = yin_parse_qname(ctx, cur_stmt, subelem, exts);
                break;
            case LY_STMT_ERROR_APP_TAG:
            case LY_STMT_KEY:
                ret = yin_parse_simple_elem(ctx, parent, cur_stmt, subelem, YIN_ARG_VALUE, Y_STR_ARG, exts);
                break;
            case LY_STMT_PRESENCE:
                ret = yin_parse_simple_elem(ctx, *(const char **)subelem->dest, cur_stmt, subelem, YIN_ARG_VALUE, Y_STR_ARG, exts);
                break;
            case LY_STMT_DEVIATE:
                ret = yin_parse_deviate(ctx, (struct lysp_deviate **)subelem->dest);
                break;
            case LY_STMT_DEVIATION:
                ret = yin_parse_deviation(ctx, (struct lysp_deviation **)subelem->dest);
                break;
            case LY_STMT_ENUM:
                ret = yin_parse_enum(ctx, (struct lysp_type *)subelem->dest);
                break;
            case LY_STMT_ERROR_MESSAGE:
                ret = yin_parse_err_msg(ctx, parent, (const char **)subelem->dest, exts);
                break;
            case LY_STMT_EXTENSION:
                ret = yin_parse_extension(ctx, (struct lysp_ext **)subelem->dest);
                break;
            case LY_STMT_FEATURE:
                ret = yin_parse_feature(ctx, (struct lysp_feature **)subelem->dest);
                break;
            case LY_STMT_FRACTION_DIGITS:
                ret = yin_parse_fracdigits(ctx, (struct lysp_type *)subelem->dest);
                break;
            case LY_STMT_GROUPING:
                ret = yin_parse_grouping(ctx, (struct tree_node_meta *)subelem->dest);
                break;
            case LY_STMT_IDENTITY:
                ret = yin_parse_identity(ctx, (struct lysp_ident **)subelem->dest);
                break;
            case LY_STMT_UNIQUE:
            case LY_STMT_IF_FEATURE:
                ret = yin_parse_qname(ctx, cur_stmt, subelem, exts);
                break;
            case LY_STMT_UNITS:
                ret = yin_parse_simple_elem(ctx, *(const char **)subelem->dest, cur_stmt, subelem, YIN_ARG_NAME, Y_STR_ARG, exts);
                break;
            case LY_STMT_IMPORT:
                ret = yin_parse_import(ctx, (struct import_meta *)subelem->dest);
                break;
            case LY_STMT_INCLUDE:
                if ((parent_stmt == LY_STMT_SUBMODULE) && (PARSER_CUR_PMOD(ctx)->version == LYS_VERSION_1_1)) {
                    LOGWRN(PARSER_CTX(ctx), "YANG version 1.1 expects all includes in main module, includes in "
                            "submodules (%s) are not necessary.", ((struct lysp_submodule *)PARSER_CUR_PMOD(ctx))->name);
                }
                ret = yin_parse_include(ctx, (struct include_meta *)subelem->dest);
                break;
            case LY_STMT_INPUT:
            case LY_STMT_OUTPUT:
                ret = yin_parse_inout(ctx, cur_stmt, (struct inout_meta *)subelem->dest);
                break;
            case LY_STMT_LEAF:
                ret = yin_parse_leaf(ctx, (struct tree_node_meta *)subelem->dest);
                break;
            case LY_STMT_LEAF_LIST:
                ret = yin_parse_leaflist(ctx, (struct tree_node_meta *)subelem->dest);
                break;
            case LY_STMT_LENGTH:
                ret = yin_parse_length(ctx, (struct lysp_type *)subelem->dest);
                break;
            case LY_STMT_LIST:
                ret = yin_parse_list(ctx, (struct tree_node_meta *)subelem->dest);
                break;
            case LY_STMT_MANDATORY:
                ret = yin_parse_mandatory(ctx, (uint16_t *)subelem->dest, exts);
                break;
            case LY_STMT_MAX_ELEMENTS:
            case LY_STMT_MIN_ELEMENTS:
                ret = yin_parse_minmax(ctx, parent_stmt, cur_stmt, subelem->dest);
                break;
            case LY_STMT_MODIFIER:
                ret = yin_parse_modifier(ctx, parent, (const char **)subelem->dest, exts);
                break;
            case LY_STMT_MUST:
                ret = yin_parse_must(ctx, (struct lysp_restr **)subelem->dest);
                break;
            case LY_STMT_NAMESPACE:
                ret = yin_parse_simple_elem(ctx, parent, cur_stmt, subelem, YIN_ARG_URI, Y_STR_ARG, exts);
                break;
            case LY_STMT_NOTIFICATION:
                ret = yin_parse_notification(ctx, (struct tree_node_meta *)subelem->dest);
                break;
            case LY_STMT_ORDERED_BY:
                ret = yin_parse_orderedby(ctx, parent, (uint16_t *)subelem->dest, exts);
                break;
            case LY_STMT_PATH:
                ret = yin_parse_path(ctx, (struct lysp_type *)subelem->dest);
                break;
            case LY_STMT_PATTERN:
                ret = yin_parse_pattern(ctx, (struct lysp_type *)subelem->dest);
                break;
            case LY_STMT_VALUE:
            case LY_STMT_POSITION:
                ret = yin_parse_value_pos(ctx, cur_stmt, (struct lysp_type_enum *)subelem->dest);
                break;
            case LY_STMT_PREFIX:
                ret = yin_parse_simple_elem(ctx, *(const char **)subelem->dest, cur_stmt, subelem, YIN_ARG_VALUE,
                        Y_IDENTIF_ARG, exts);
                break;
            case LY_STMT_RANGE:
                ret = yin_parse_range(ctx, (struct lysp_type *)subelem->dest);
                break;
            case LY_STMT_REFINE:
                ret = yin_parse_refine(ctx, (struct lysp_refine **)subelem->dest);
                break;
            case LY_STMT_REQUIRE_INSTANCE:
                ret = yin_pasrse_reqinstance(ctx, (struct lysp_type *)subelem->dest);
                break;
            case LY_STMT_REVISION:
                ret = yin_parse_revision(ctx, (struct lysp_revision **)subelem->dest);
                break;
            case LY_STMT_REVISION_DATE:
                ret = yin_parse_revision_date(ctx, (char *)subelem->dest, exts);
                break;
            case LY_STMT_STATUS:
                ret = yin_parse_status(ctx, (uint16_t *)subelem->dest, exts);
                break;
            case LY_STMT_TYPE:
                ret = yin_parse_type(ctx, parent_stmt, subelem);
                break;
            case LY_STMT_TYPEDEF:
                ret = yin_parse_typedef(ctx, (struct tree_node_meta *)subelem->dest);
                break;
            case LY_STMT_USES:
                ret = yin_parse_uses(ctx, (struct tree_node_meta *)subelem->dest);
                break;
            case LY_STMT_WHEN:
                ret = yin_parse_when(ctx, (struct lysp_when **)subelem->dest);
                break;
            case LY_STMT_YANG_VERSION:
                ret = yin_parse_yangversion(ctx, parent, (uint8_t *)subelem->dest, exts);
                break;
            case LY_STMT_YIN_ELEMENT:
                ret = yin_parse_yin_element(ctx, parent, (uint16_t *)subelem->dest, exts);
                break;
            case LY_STMT_ARG_TEXT:
            case LY_STMT_ARG_VALUE:
                /* TODO what to do with content/attributes? */
                LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);
                while (ctx->xmlctx->status == LYXML_ATTRIBUTE) {
                    LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);
                    LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);
                }
                ret = yin_parse_content(ctx, NULL, 0, parent, cur_stmt, (const char **)subelem->dest, NULL);
                break;
            default:
                LOGINT(ctx->xmlctx->ctx);
                ret = LY_EINT;
            }
            LY_CHECK_GOTO(ret, cleanup);

            LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);
        }
    } else {
        LY_CHECK_RET(ret);
        /* elements with text or none content */
        /* save text content, if text_content isn't set, it's just ignored */
        /* no resources are allocated in this branch, no need to use cleanup label */
        LY_CHECK_RET(yin_validate_value(ctx, Y_STR_ARG));
        if (text_content) {
            INSERT_STRING_RET(ctx->xmlctx->ctx, ctx->xmlctx->value, ctx->xmlctx->value_len, ctx->xmlctx->dynamic, *text_content);
            LY_CHECK_RET(!*text_content, LY_EMEM);
        }

        LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);
    }

    /* mandatory subelements are checked only after whole element was succesfully parsed */
    LY_CHECK_RET(yin_check_subelem_mandatory_constraint(ctx, subelem_info, subelem_info_size, parent_stmt));

cleanup:
    return ret;
}